

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.t.cpp
# Opt level: O2

void relop<char,int,long>(env *lest_env)

{
  ostream *poVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  text *ptVar6;
  bool bVar7;
  allocator<char> local_4cf1;
  failure *local_4cf0;
  ctx lest__ctx_section;
  optional<char> d;
  uint local_4cbc;
  result score;
  optional<int> e1;
  optional<long> e2;
  allocator<char> *local_4c78 [15];
  ctx lest__ctx_setup;
  text local_4bf0;
  location local_4bd0;
  text local_4ba8;
  location local_4b88;
  text local_4b60;
  location local_4b40;
  text local_4b18;
  location local_4af8;
  text local_4ad0;
  location local_4ab0;
  text local_4a88;
  location local_4a68;
  text local_4a40;
  location local_4a20;
  text local_49f8;
  location local_49d8;
  text local_49b0;
  location local_4990;
  text local_4968;
  location local_4948;
  text local_4920;
  location local_4900;
  text local_48d8;
  location local_48b8;
  text local_4890;
  location local_4870;
  text local_4848;
  location local_4828;
  text local_4800;
  location local_47e0;
  text local_47b8;
  location local_4798;
  text local_4770;
  location local_4750;
  text local_4728;
  location local_4708;
  text local_46e0;
  location local_46c0;
  text local_4698;
  location local_4678;
  text local_4650;
  location local_4630;
  text local_4608;
  location local_45e8;
  text local_45c0;
  location local_45a0;
  text local_4578;
  location local_4558;
  text local_4530;
  location local_4510;
  text local_44e8;
  location local_44c8;
  text local_44a0;
  location local_4480;
  text local_4458;
  location local_4438;
  text local_4410;
  location local_43f0;
  text local_43c8;
  location local_43a8;
  text local_4380;
  location local_4360;
  text local_4338;
  location local_4318;
  text local_42f0;
  location local_42d0;
  text local_42a8;
  location local_4288;
  text local_4260;
  location local_4240;
  text local_4218;
  location local_41f8;
  text local_41d0;
  location local_41b0;
  text local_4188;
  location local_4168;
  text local_4140;
  location local_4120;
  text local_40f8;
  location local_40d8;
  text local_40b0;
  location local_4090;
  text local_4068;
  location local_4048;
  text local_4020;
  location local_4000;
  text local_3fd8;
  location local_3fb8 [2];
  location local_3f68 [2];
  location local_3f18 [2];
  location local_3ec8 [2];
  location local_3e78 [2];
  location local_3e28 [2];
  location local_3dd8 [2];
  location local_3d88 [2];
  location local_3d38 [2];
  location local_3ce8 [2];
  location local_3c98 [2];
  location local_3c48 [2];
  location local_3bf8 [2];
  location local_3ba8 [2];
  location local_3b58 [2];
  location local_3b08 [2];
  location local_3ab8 [2];
  location local_3a68 [2];
  location local_3a18 [2];
  location local_39c8 [2];
  location local_3978 [2];
  location local_3928 [2];
  location local_38d8 [2];
  location local_3888 [2];
  location local_3838 [2];
  location local_37e8 [2];
  location local_3798 [2];
  location local_3748 [2];
  location local_36f8 [2];
  location local_36a8 [2];
  location local_3658 [2];
  location local_3608 [2];
  location local_35b8 [2];
  location local_3568 [2];
  location local_3518 [2];
  location local_34c8 [2];
  location local_3478 [2];
  location local_3428 [2];
  location local_33d8 [2];
  location local_3388 [2];
  location local_3338 [2];
  location local_32e8 [2];
  location local_3298 [2];
  location local_3248;
  location local_3220;
  text local_31d8;
  string local_31b8 [32];
  text local_3198 [2];
  text local_3158;
  string local_3138 [32];
  text local_3118 [2];
  text local_30d8;
  string local_30b8 [32];
  text local_3098 [2];
  text local_3058;
  string local_3038 [32];
  text local_3018 [2];
  text local_2fd8;
  string local_2fb8 [32];
  text local_2f98 [2];
  text local_2f58;
  string local_2f38 [32];
  text local_2f18 [2];
  text local_2ed8;
  string local_2eb8 [32];
  text local_2e98 [2];
  text local_2e58;
  string local_2e38 [32];
  text local_2e18 [2];
  text local_2dd8;
  string local_2db8 [32];
  text local_2d98 [2];
  text local_2d58;
  string local_2d38 [32];
  text local_2d18 [2];
  text local_2cd8;
  string local_2cb8 [32];
  text local_2c98 [2];
  text local_2c58;
  string local_2c38 [32];
  text local_2c18 [2];
  text local_2bd8;
  string local_2bb8 [32];
  text local_2b98 [2];
  text local_2b58;
  string local_2b38 [32];
  text local_2b18 [2];
  text local_2ad8;
  string local_2ab8 [32];
  text local_2a98 [2];
  text local_2a58;
  string local_2a38 [32];
  text local_2a18 [2];
  text local_29d8;
  string local_29b8 [32];
  text local_2998 [2];
  text local_2958;
  string local_2938 [32];
  text local_2918 [2];
  text local_28d8;
  string local_28b8 [32];
  text local_2898 [2];
  text local_2858;
  string local_2838 [32];
  text local_2818 [2];
  text local_27d8;
  string local_27b8 [32];
  text local_2798 [2];
  text local_2758;
  string local_2738 [32];
  text local_2718 [2];
  text local_26d8;
  string local_26b8 [32];
  text local_2698 [2];
  text local_2658;
  string local_2638 [32];
  text local_2618 [2];
  text local_25d8;
  string local_25b8 [32];
  text local_2598 [2];
  text local_2558;
  string local_2538 [32];
  text local_2518 [2];
  text local_24d8;
  string local_24b8 [32];
  text local_2498 [2];
  text local_2458;
  string local_2438 [32];
  text local_2418 [2];
  text local_23d8;
  string local_23b8 [32];
  text local_2398 [2];
  text local_2358;
  string local_2338 [32];
  text local_2318 [2];
  text local_22d8;
  string local_22b8 [32];
  text local_2298 [2];
  text local_2258;
  string local_2238 [32];
  text local_2218 [2];
  text local_21d8;
  string local_21b8 [32];
  text local_2198 [2];
  text local_2158;
  string local_2138 [32];
  text local_2118 [2];
  text local_20d8;
  string local_20b8 [32];
  text local_2098 [2];
  text local_2058;
  string local_2038 [32];
  text local_2018 [2];
  text local_1fd8;
  string local_1fb8 [32];
  text local_1f98 [2];
  text local_1f58;
  string local_1f38 [32];
  text local_1f18 [2];
  text local_1ed8;
  string local_1eb8 [32];
  text local_1e98 [2];
  text local_1e58;
  string local_1e38 [32];
  text local_1e18 [2];
  text local_1dd8;
  string local_1db8 [32];
  text local_1d98 [2];
  text local_1d58;
  string local_1d38 [32];
  text local_1d18 [2];
  text local_1cd8;
  string local_1cb8 [32];
  text local_1c98 [2];
  text local_1c58;
  string local_1c38 [32];
  text local_1c18;
  text local_1bf8 [3];
  text local_1b90;
  string local_1b70 [32];
  text local_1b50 [2];
  text local_1b10;
  string local_1af0 [32];
  text local_1ad0 [2];
  text local_1a90;
  string local_1a70 [32];
  text local_1a50 [2];
  text local_1a10;
  string local_19f0 [32];
  text local_19d0 [2];
  text local_1990;
  string local_1970 [32];
  text local_1950 [2];
  text local_1910;
  string local_18f0 [32];
  text local_18d0 [2];
  text local_1890;
  string local_1870 [32];
  text local_1850 [2];
  text local_1810;
  string local_17f0 [32];
  text local_17d0 [2];
  text local_1790;
  string local_1770 [32];
  text local_1750 [2];
  text local_1710;
  string local_16f0 [32];
  text local_16d0 [2];
  text local_1690;
  string local_1670 [32];
  text local_1650 [2];
  text local_1610;
  string local_15f0 [32];
  text local_15d0 [2];
  text local_1590;
  string local_1570 [32];
  text local_1550 [2];
  text local_1510;
  string local_14f0 [32];
  text local_14d0 [2];
  text local_1490;
  string local_1470 [32];
  text local_1450 [2];
  text local_1410;
  string local_13f0 [32];
  text local_13d0 [2];
  text local_1390;
  string local_1370 [32];
  text local_1350 [2];
  text local_1310;
  string local_12f0 [32];
  text local_12d0 [2];
  text local_1290;
  string local_1270 [32];
  text local_1250 [2];
  text local_1210;
  string local_11f0 [32];
  text local_11d0 [2];
  text local_1190;
  string local_1170 [32];
  text local_1150 [2];
  text local_1110;
  string local_10f0 [32];
  text local_10d0 [2];
  text local_1090;
  string local_1070 [32];
  text local_1050 [2];
  text local_1010;
  string local_ff0 [32];
  text local_fd0 [2];
  text local_f90;
  string local_f70 [32];
  text local_f50 [2];
  text local_f10;
  string local_ef0 [32];
  text local_ed0 [2];
  text local_e90;
  string local_e70 [32];
  text local_e50 [2];
  text local_e10;
  string local_df0 [32];
  text local_dd0 [2];
  text local_d90;
  string local_d70 [32];
  text local_d50 [2];
  text local_d10;
  string local_cf0 [32];
  text local_cd0 [2];
  text local_c90;
  string local_c70 [32];
  text local_c50 [2];
  text local_c10;
  string local_bf0 [32];
  text local_bd0 [2];
  text local_b90;
  string local_b70 [32];
  text local_b50 [2];
  text local_b10;
  string local_af0 [32];
  text local_ad0 [2];
  text local_a90;
  string local_a70 [32];
  text local_a50 [2];
  text local_a10;
  string local_9f0 [32];
  text local_9d0 [2];
  text local_990;
  string local_970 [32];
  text local_950 [2];
  text local_910;
  string local_8f0 [32];
  text local_8d0 [2];
  text local_890;
  string local_870 [32];
  text local_850 [2];
  text local_810;
  string local_7f0 [32];
  text local_7d0 [2];
  text local_790;
  string local_770 [32];
  text local_750 [2];
  text local_710;
  string local_6f0 [32];
  text local_6d0 [2];
  text local_690;
  string local_670 [32];
  text local_650 [2];
  text local_610;
  string local_5f0 [32];
  text local_5d0;
  text local_5b0;
  text local_590;
  text local_570;
  text local_550;
  text local_530;
  text local_510;
  text local_4f0;
  text local_4d0;
  text local_4b0;
  text local_490;
  text local_470;
  text local_450;
  text local_430;
  text local_410;
  text local_3f0;
  text local_3d0;
  text local_3b0;
  text local_390;
  text local_370;
  text local_350;
  text local_330;
  text local_310;
  text local_2f0;
  text local_2d0;
  text local_2b0;
  text local_290;
  text local_270;
  text local_250;
  text local_230;
  text local_210;
  text local_1f0;
  text local_1d0;
  text local_1b0;
  text local_190;
  text local_170;
  text local_150;
  text local_130;
  text local_110;
  text local_f0;
  text local_d0;
  text local_b0;
  text local_90;
  text local_70;
  text local_50;
  
  iVar3 = 0;
  iVar5 = 1;
  do {
    if (iVar5 <= iVar3) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1bf8,"",(allocator<char> *)local_4c78);
    lest::ctx::ctx(&lest__ctx_setup,lest_env,local_1bf8);
    std::__cxx11::string::~string((string *)local_1bf8);
    while (bVar7 = lest__ctx_setup.once != false, lest__ctx_setup.once = false, bVar7) {
      d.super__Optional_base<char,_true,_true>._M_payload.super__Optional_payload_base<char>.
      _M_engaged = false;
      e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
      _M_payload._M_value = 6;
      e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
      _M_engaged = true;
      e2.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
      _M_payload._M_value = 7;
      e2.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
      _M_engaged = true;
      if (iVar3 == 0) {
        relop<char,_int,_long>::id395 = iVar5 + -1;
        iVar5 = iVar5 + 1;
      }
      if (relop<char,_int,_long>::id395 == iVar3) {
        uVar4 = 1;
        uVar2 = 0;
        while (uVar2 < uVar4) {
          ptVar6 = &local_5d0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)ptVar6,"engaged    == engaged",(allocator<char> *)local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,ptVar6);
          while( true ) {
            std::__cxx11::string::~string((string *)ptVar6);
            bVar7 = lest__ctx_section.once == false;
            lest__ctx_section.once = false;
            if (bVar7) break;
            local_4c78[0] = (allocator<char> *)&e1;
            lest::expression_lhs<std::optional<int>const&>::operator==
                      (&score,(expression_lhs<std::optional<int>const&> *)local_4c78,
                       (optional<int> *)local_4c78[0]);
            if (score.passed == false) {
              local_4cf0 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_5f0,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)local_4c78);
              std::__cxx11::string::string((string *)&local_3220,local_5f0);
              local_3220.line = 0x18b;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1c18,"e1 == e1",(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_610,(string *)&score.decomposition);
              lest::failure::failure(local_4cf0,&local_3220,&local_1c18,&local_610);
              __cxa_throw(local_4cf0,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_1c38,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)local_3fb8,local_1c38);
              local_3fb8[0].line = 0x18b;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_3fd8,"e1 == e1",&local_4cf1);
              std::__cxx11::string::string((string *)&local_1c58,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)local_4c78,local_3fb8,&local_3fd8,&local_1c58,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_50,lest_env);
              lest::report(poVar1,(message *)local_4c78,&local_50);
              std::__cxx11::string::~string((string *)&local_50);
              lest::message::~message((message *)local_4c78);
              std::__cxx11::string::~string((string *)&local_1c58);
              std::__cxx11::string::~string((string *)&local_3fd8);
              std::__cxx11::string::~string((string *)local_3fb8);
              std::__cxx11::string::~string(local_1c38);
            }
            ptVar6 = &score.decomposition;
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar4 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<char,_int,_long>::id396 = iVar5 + -1;
        iVar5 = iVar5 + 1;
      }
      if (relop<char,_int,_long>::id396 == iVar3) {
        uVar4 = 1;
        uVar2 = 0;
        while (uVar2 < uVar4) {
          ptVar6 = local_650;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)ptVar6,"engaged    == disengaged",(allocator<char> *)local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,ptVar6);
          while( true ) {
            std::__cxx11::string::~string((string *)ptVar6);
            bVar7 = lest__ctx_section.once == false;
            lest__ctx_section.once = false;
            if (bVar7) break;
            bVar7 = e1.super__Optional_base<int,_true,_true>._M_payload.
                    super__Optional_payload_base<int>._M_engaged ==
                    d.super__Optional_base<char,_true,_true>._M_payload.
                    super__Optional_payload_base<char>._M_engaged;
            if ((e1.super__Optional_base<int,_true,_true>._M_payload.
                 super__Optional_payload_base<int>._M_engaged & bVar7) == 1) {
              bVar7 = e1.super__Optional_base<int,_true,_true>._M_payload.
                      super__Optional_payload_base<int>._M_payload._M_value ==
                      d.super__Optional_base<char,_true,_true>._M_payload.
                      super__Optional_payload_base<char>._M_payload._M_value;
            }
            local_4cbc = CONCAT31(local_4cbc._1_3_,bVar7) ^ 1;
            local_4c78[0] = (allocator<char> *)&local_4cbc;
            lest::expression_lhs::operator_cast_to_result(&score,(expression_lhs *)local_4c78);
            if (score.passed == false) {
              local_4cf0 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_670,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)local_4c78);
              std::__cxx11::string::string((string *)&local_3248,local_670);
              local_3248.line = 0x18c;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_1c98,"!(e1 == d )",(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_690,(string *)&score.decomposition);
              lest::failure::failure(local_4cf0,&local_3248,local_1c98,&local_690);
              __cxa_throw(local_4cf0,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_1cb8,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_4000,local_1cb8);
              local_4000.line = 0x18c;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4020,"!(e1 == d )",&local_4cf1);
              std::__cxx11::string::string((string *)&local_1cd8,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)local_4c78,&local_4000,&local_4020,&local_1cd8,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_70,lest_env);
              lest::report(poVar1,(message *)local_4c78,&local_70);
              std::__cxx11::string::~string((string *)&local_70);
              lest::message::~message((message *)local_4c78);
              std::__cxx11::string::~string((string *)&local_1cd8);
              std::__cxx11::string::~string((string *)&local_4020);
              std::__cxx11::string::~string((string *)&local_4000);
              std::__cxx11::string::~string(local_1cb8);
            }
            ptVar6 = &score.decomposition;
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar4 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<char,_int,_long>::id397 = iVar5 + -1;
        iVar5 = iVar5 + 1;
      }
      if (relop<char,_int,_long>::id397 == iVar3) {
        uVar4 = 1;
        uVar2 = 0;
        while (uVar2 < uVar4) {
          ptVar6 = local_6d0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)ptVar6,"disengaged == engaged",(allocator<char> *)local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,ptVar6);
          while( true ) {
            std::__cxx11::string::~string((string *)ptVar6);
            bVar7 = lest__ctx_section.once == false;
            lest__ctx_section.once = false;
            if (bVar7) break;
            bVar7 = d.super__Optional_base<char,_true,_true>._M_payload.
                    super__Optional_payload_base<char>._M_engaged ==
                    e1.super__Optional_base<int,_true,_true>._M_payload.
                    super__Optional_payload_base<int>._M_engaged;
            if ((d.super__Optional_base<char,_true,_true>._M_payload.
                 super__Optional_payload_base<char>._M_engaged & bVar7) == 1) {
              bVar7 = e1.super__Optional_base<int,_true,_true>._M_payload.
                      super__Optional_payload_base<int>._M_payload._M_value ==
                      d.super__Optional_base<char,_true,_true>._M_payload.
                      super__Optional_payload_base<char>._M_payload._M_value;
            }
            local_4cbc = CONCAT31(local_4cbc._1_3_,bVar7) ^ 1;
            local_4c78[0] = (allocator<char> *)&local_4cbc;
            lest::expression_lhs::operator_cast_to_result(&score,(expression_lhs *)local_4c78);
            if (score.passed == false) {
              local_4cf0 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_6f0,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)local_4c78);
              std::__cxx11::string::string((string *)local_3298,local_6f0);
              local_3298[0].line = 0x18d;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_1d18,"!(d == e1)",(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_710,(string *)&score.decomposition);
              lest::failure::failure(local_4cf0,local_3298,local_1d18,&local_710);
              __cxa_throw(local_4cf0,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_1d38,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_4048,local_1d38);
              local_4048.line = 0x18d;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4068,"!(d == e1)",&local_4cf1);
              std::__cxx11::string::string((string *)&local_1d58,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)local_4c78,&local_4048,&local_4068,&local_1d58,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_90,lest_env);
              lest::report(poVar1,(message *)local_4c78,&local_90);
              std::__cxx11::string::~string((string *)&local_90);
              lest::message::~message((message *)local_4c78);
              std::__cxx11::string::~string((string *)&local_1d58);
              std::__cxx11::string::~string((string *)&local_4068);
              std::__cxx11::string::~string((string *)&local_4048);
              std::__cxx11::string::~string(local_1d38);
            }
            ptVar6 = &score.decomposition;
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar4 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<char,_int,_long>::id399 = iVar5 + -1;
        iVar5 = iVar5 + 1;
      }
      if (relop<char,_int,_long>::id399 == iVar3) {
        uVar4 = 1;
        uVar2 = 0;
        while (uVar2 < uVar4) {
          ptVar6 = local_750;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)ptVar6,"engaged    != engaged",(allocator<char> *)local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,ptVar6);
          while( true ) {
            std::__cxx11::string::~string((string *)ptVar6);
            bVar7 = lest__ctx_section.once == false;
            lest__ctx_section.once = false;
            if (bVar7) break;
            local_4c78[0] = (allocator<char> *)&e1;
            lest::expression_lhs<std::optional<int>const&>::operator!=
                      (&score,(expression_lhs<std::optional<int>const&> *)local_4c78,&e2);
            if (score.passed == false) {
              local_4cf0 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_770,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)local_4c78);
              std::__cxx11::string::string((string *)local_32e8,local_770);
              local_32e8[0].line = 399;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_1d98,"e1 != e2",(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_790,(string *)&score.decomposition);
              lest::failure::failure(local_4cf0,local_32e8,local_1d98,&local_790);
              __cxa_throw(local_4cf0,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_1db8,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_4090,local_1db8);
              local_4090.line = 399;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_40b0,"e1 != e2",&local_4cf1);
              std::__cxx11::string::string((string *)&local_1dd8,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)local_4c78,&local_4090,&local_40b0,&local_1dd8,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_b0,lest_env);
              lest::report(poVar1,(message *)local_4c78,&local_b0);
              std::__cxx11::string::~string((string *)&local_b0);
              lest::message::~message((message *)local_4c78);
              std::__cxx11::string::~string((string *)&local_1dd8);
              std::__cxx11::string::~string((string *)&local_40b0);
              std::__cxx11::string::~string((string *)&local_4090);
              std::__cxx11::string::~string(local_1db8);
            }
            ptVar6 = &score.decomposition;
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar4 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<char,_int,_long>::id400 = iVar5 + -1;
        iVar5 = iVar5 + 1;
      }
      if (relop<char,_int,_long>::id400 == iVar3) {
        uVar4 = 1;
        uVar2 = 0;
        while (uVar2 < uVar4) {
          ptVar6 = local_7d0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)ptVar6,"engaged    != disengaged",(allocator<char> *)local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,ptVar6);
          while( true ) {
            std::__cxx11::string::~string((string *)ptVar6);
            bVar7 = lest__ctx_section.once == false;
            lest__ctx_section.once = false;
            if (bVar7) break;
            local_4c78[0] = (allocator<char> *)&e1;
            lest::expression_lhs<std::optional<int>const&>::operator!=
                      (&score,(expression_lhs<std::optional<int>const&> *)local_4c78,&d);
            if (score.passed == false) {
              local_4cf0 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_7f0,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)local_4c78);
              std::__cxx11::string::string((string *)local_3338,local_7f0);
              local_3338[0].line = 400;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_1e18,"e1 != d",(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_810,(string *)&score.decomposition);
              lest::failure::failure(local_4cf0,local_3338,local_1e18,&local_810);
              __cxa_throw(local_4cf0,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_1e38,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_40d8,local_1e38);
              local_40d8.line = 400;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_40f8,"e1 != d",&local_4cf1);
              std::__cxx11::string::string((string *)&local_1e58,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)local_4c78,&local_40d8,&local_40f8,&local_1e58,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_d0,lest_env);
              lest::report(poVar1,(message *)local_4c78,&local_d0);
              std::__cxx11::string::~string((string *)&local_d0);
              lest::message::~message((message *)local_4c78);
              std::__cxx11::string::~string((string *)&local_1e58);
              std::__cxx11::string::~string((string *)&local_40f8);
              std::__cxx11::string::~string((string *)&local_40d8);
              std::__cxx11::string::~string(local_1e38);
            }
            ptVar6 = &score.decomposition;
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar4 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<char,_int,_long>::id401 = iVar5 + -1;
        iVar5 = iVar5 + 1;
      }
      if (relop<char,_int,_long>::id401 == iVar3) {
        uVar4 = 1;
        uVar2 = 0;
        while (uVar2 < uVar4) {
          ptVar6 = local_850;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)ptVar6,"disengaged != engaged",(allocator<char> *)local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,ptVar6);
          while( true ) {
            std::__cxx11::string::~string((string *)ptVar6);
            bVar7 = lest__ctx_section.once == false;
            lest__ctx_section.once = false;
            if (bVar7) break;
            local_4c78[0] = (allocator<char> *)&d;
            lest::expression_lhs<std::optional<char>const&>::operator!=
                      (&score,(expression_lhs<std::optional<char>const&> *)local_4c78,&e2);
            if (score.passed == false) {
              local_4cf0 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_870,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)local_4c78);
              std::__cxx11::string::string((string *)local_3388,local_870);
              local_3388[0].line = 0x191;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_1e98,"d != e2",(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_890,(string *)&score.decomposition);
              lest::failure::failure(local_4cf0,local_3388,local_1e98,&local_890);
              __cxa_throw(local_4cf0,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_1eb8,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_4120,local_1eb8);
              local_4120.line = 0x191;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4140,"d != e2",&local_4cf1);
              std::__cxx11::string::string((string *)&local_1ed8,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)local_4c78,&local_4120,&local_4140,&local_1ed8,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_f0,lest_env);
              lest::report(poVar1,(message *)local_4c78,&local_f0);
              std::__cxx11::string::~string((string *)&local_f0);
              lest::message::~message((message *)local_4c78);
              std::__cxx11::string::~string((string *)&local_1ed8);
              std::__cxx11::string::~string((string *)&local_4140);
              std::__cxx11::string::~string((string *)&local_4120);
              std::__cxx11::string::~string(local_1eb8);
            }
            ptVar6 = &score.decomposition;
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar4 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<char,_int,_long>::id403 = iVar5 + -1;
        iVar5 = iVar5 + 1;
      }
      if (relop<char,_int,_long>::id403 == iVar3) {
        uVar4 = 1;
        uVar2 = 0;
        while (uVar2 < uVar4) {
          ptVar6 = local_8d0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)ptVar6,"engaged    <  engaged",(allocator<char> *)local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,ptVar6);
          while( true ) {
            std::__cxx11::string::~string((string *)ptVar6);
            bVar7 = lest__ctx_section.once == false;
            lest__ctx_section.once = false;
            if (bVar7) break;
            local_4c78[0] = (allocator<char> *)&e1;
            lest::expression_lhs<std::optional<int>const&>::operator<
                      (&score,(expression_lhs<std::optional<int>const&> *)local_4c78,&e2);
            if (score.passed == false) {
              local_4cf0 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_8f0,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)local_4c78);
              std::__cxx11::string::string((string *)local_33d8,local_8f0);
              local_33d8[0].line = 0x193;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_1f18,"e1 < e2",(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_910,(string *)&score.decomposition);
              lest::failure::failure(local_4cf0,local_33d8,local_1f18,&local_910);
              __cxa_throw(local_4cf0,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_1f38,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_4168,local_1f38);
              local_4168.line = 0x193;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4188,"e1 < e2",&local_4cf1);
              std::__cxx11::string::string((string *)&local_1f58,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)local_4c78,&local_4168,&local_4188,&local_1f58,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_110,lest_env);
              lest::report(poVar1,(message *)local_4c78,&local_110);
              std::__cxx11::string::~string((string *)&local_110);
              lest::message::~message((message *)local_4c78);
              std::__cxx11::string::~string((string *)&local_1f58);
              std::__cxx11::string::~string((string *)&local_4188);
              std::__cxx11::string::~string((string *)&local_4168);
              std::__cxx11::string::~string(local_1f38);
            }
            ptVar6 = &score.decomposition;
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar4 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<char,_int,_long>::id404 = iVar5 + -1;
        iVar5 = iVar5 + 1;
      }
      if (relop<char,_int,_long>::id404 == iVar3) {
        uVar4 = 1;
        uVar2 = 0;
        while (uVar2 < uVar4) {
          ptVar6 = local_950;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)ptVar6,"engaged    <  disengaged",(allocator<char> *)local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,ptVar6);
          while( true ) {
            std::__cxx11::string::~string((string *)ptVar6);
            bVar7 = lest__ctx_section.once == false;
            lest__ctx_section.once = false;
            if (bVar7) break;
            bVar7 = true;
            if (d.super__Optional_base<char,_true,_true>._M_payload.
                super__Optional_payload_base<char>._M_engaged == true) {
              if (e1.super__Optional_base<int,_true,_true>._M_payload.
                  super__Optional_payload_base<int>._M_engaged == true) {
                bVar7 = d.super__Optional_base<char,_true,_true>._M_payload.
                        super__Optional_payload_base<char>._M_payload._M_value <=
                        e1.super__Optional_base<int,_true,_true>._M_payload.
                        super__Optional_payload_base<int>._M_payload._M_value;
              }
              else {
                bVar7 = false;
              }
            }
            local_4cbc = CONCAT31(local_4cbc._1_3_,bVar7);
            local_4c78[0] = (allocator<char> *)&local_4cbc;
            lest::expression_lhs::operator_cast_to_result(&score,(expression_lhs *)local_4c78);
            if (score.passed == false) {
              local_4cf0 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_970,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)local_4c78);
              std::__cxx11::string::string((string *)local_3428,local_970);
              local_3428[0].line = 0x194;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_1f98,"!(e1 < d )",(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_990,(string *)&score.decomposition);
              lest::failure::failure(local_4cf0,local_3428,local_1f98,&local_990);
              __cxa_throw(local_4cf0,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_1fb8,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_41b0,local_1fb8);
              local_41b0.line = 0x194;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_41d0,"!(e1 < d )",&local_4cf1);
              std::__cxx11::string::string((string *)&local_1fd8,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)local_4c78,&local_41b0,&local_41d0,&local_1fd8,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_130,lest_env);
              lest::report(poVar1,(message *)local_4c78,&local_130);
              std::__cxx11::string::~string((string *)&local_130);
              lest::message::~message((message *)local_4c78);
              std::__cxx11::string::~string((string *)&local_1fd8);
              std::__cxx11::string::~string((string *)&local_41d0);
              std::__cxx11::string::~string((string *)&local_41b0);
              std::__cxx11::string::~string(local_1fb8);
            }
            ptVar6 = &score.decomposition;
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar4 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<char,_int,_long>::id405 = iVar5 + -1;
        iVar5 = iVar5 + 1;
      }
      if (relop<char,_int,_long>::id405 == iVar3) {
        uVar4 = 1;
        uVar2 = 0;
        while (uVar2 < uVar4) {
          ptVar6 = local_9d0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)ptVar6,"disengaged <  engaged",(allocator<char> *)local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,ptVar6);
          while( true ) {
            std::__cxx11::string::~string((string *)ptVar6);
            bVar7 = lest__ctx_section.once == false;
            lest__ctx_section.once = false;
            if (bVar7) break;
            local_4c78[0] = (allocator<char> *)&d;
            lest::expression_lhs<std::optional<char>const&>::operator<
                      (&score,(expression_lhs<std::optional<char>const&> *)local_4c78,&e2);
            if (score.passed == false) {
              local_4cf0 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_9f0,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)local_4c78);
              std::__cxx11::string::string((string *)local_3478,local_9f0);
              local_3478[0].line = 0x195;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_2018,"d < e2",(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_a10,(string *)&score.decomposition);
              lest::failure::failure(local_4cf0,local_3478,local_2018,&local_a10);
              __cxa_throw(local_4cf0,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_2038,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_41f8,local_2038);
              local_41f8.line = 0x195;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4218,"d < e2",&local_4cf1);
              std::__cxx11::string::string((string *)&local_2058,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)local_4c78,&local_41f8,&local_4218,&local_2058,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_150,lest_env);
              lest::report(poVar1,(message *)local_4c78,&local_150);
              std::__cxx11::string::~string((string *)&local_150);
              lest::message::~message((message *)local_4c78);
              std::__cxx11::string::~string((string *)&local_2058);
              std::__cxx11::string::~string((string *)&local_4218);
              std::__cxx11::string::~string((string *)&local_41f8);
              std::__cxx11::string::~string(local_2038);
            }
            ptVar6 = &score.decomposition;
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar4 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<char,_int,_long>::id407 = iVar5 + -1;
        iVar5 = iVar5 + 1;
      }
      if (relop<char,_int,_long>::id407 == iVar3) {
        uVar4 = 1;
        uVar2 = 0;
        while (uVar2 < uVar4) {
          ptVar6 = local_a50;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)ptVar6,"engaged    <= engaged",(allocator<char> *)local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,ptVar6);
          while( true ) {
            std::__cxx11::string::~string((string *)ptVar6);
            bVar7 = lest__ctx_section.once == false;
            lest__ctx_section.once = false;
            if (bVar7) break;
            local_4c78[0] = (allocator<char> *)&e1;
            lest::expression_lhs<std::optional<int>const&>::operator<=
                      (&score,(expression_lhs<std::optional<int>const&> *)local_4c78,
                       (optional<int> *)local_4c78[0]);
            if (score.passed == false) {
              local_4cf0 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_a70,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)local_4c78);
              std::__cxx11::string::string((string *)local_34c8,local_a70);
              local_34c8[0].line = 0x197;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_2098,"e1 <= e1",(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_a90,(string *)&score.decomposition);
              lest::failure::failure(local_4cf0,local_34c8,local_2098,&local_a90);
              __cxa_throw(local_4cf0,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_20b8,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_4240,local_20b8);
              local_4240.line = 0x197;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4260,"e1 <= e1",&local_4cf1);
              std::__cxx11::string::string((string *)&local_20d8,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)local_4c78,&local_4240,&local_4260,&local_20d8,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_170,lest_env);
              lest::report(poVar1,(message *)local_4c78,&local_170);
              std::__cxx11::string::~string((string *)&local_170);
              lest::message::~message((message *)local_4c78);
              std::__cxx11::string::~string((string *)&local_20d8);
              std::__cxx11::string::~string((string *)&local_4260);
              std::__cxx11::string::~string((string *)&local_4240);
              std::__cxx11::string::~string(local_20b8);
            }
            ptVar6 = &score.decomposition;
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar4 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<char,_int,_long>::id408 = iVar5 + -1;
        iVar5 = iVar5 + 1;
      }
      if (relop<char,_int,_long>::id408 == iVar3) {
        uVar4 = 1;
        uVar2 = 0;
        while (uVar2 < uVar4) {
          ptVar6 = local_ad0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)ptVar6,"engaged    <= engaged",(allocator<char> *)local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,ptVar6);
          while( true ) {
            std::__cxx11::string::~string((string *)ptVar6);
            bVar7 = lest__ctx_section.once == false;
            lest__ctx_section.once = false;
            if (bVar7) break;
            local_4c78[0] = (allocator<char> *)&e1;
            lest::expression_lhs<std::optional<int>const&>::operator<=
                      (&score,(expression_lhs<std::optional<int>const&> *)local_4c78,&e2);
            if (score.passed == false) {
              local_4cf0 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_af0,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)local_4c78);
              std::__cxx11::string::string((string *)local_3518,local_af0);
              local_3518[0].line = 0x198;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_2118,"e1 <= e2",(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_b10,(string *)&score.decomposition);
              lest::failure::failure(local_4cf0,local_3518,local_2118,&local_b10);
              __cxa_throw(local_4cf0,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_2138,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_4288,local_2138);
              local_4288.line = 0x198;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_42a8,"e1 <= e2",&local_4cf1);
              std::__cxx11::string::string((string *)&local_2158,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)local_4c78,&local_4288,&local_42a8,&local_2158,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_190,lest_env);
              lest::report(poVar1,(message *)local_4c78,&local_190);
              std::__cxx11::string::~string((string *)&local_190);
              lest::message::~message((message *)local_4c78);
              std::__cxx11::string::~string((string *)&local_2158);
              std::__cxx11::string::~string((string *)&local_42a8);
              std::__cxx11::string::~string((string *)&local_4288);
              std::__cxx11::string::~string(local_2138);
            }
            ptVar6 = &score.decomposition;
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar4 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<char,_int,_long>::id409 = iVar5 + -1;
        iVar5 = iVar5 + 1;
      }
      if (relop<char,_int,_long>::id409 == iVar3) {
        uVar4 = 1;
        uVar2 = 0;
        while (uVar2 < uVar4) {
          ptVar6 = local_b50;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)ptVar6,"engaged    <= disengaged",(allocator<char> *)local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,ptVar6);
          while( true ) {
            std::__cxx11::string::~string((string *)ptVar6);
            bVar7 = lest__ctx_section.once == false;
            lest__ctx_section.once = false;
            if (bVar7) break;
            if (e1.super__Optional_base<int,_true,_true>._M_payload.
                super__Optional_payload_base<int>._M_engaged == true) {
              bVar7 = true;
              if (d.super__Optional_base<char,_true,_true>._M_payload.
                  super__Optional_payload_base<char>._M_engaged == true) {
                bVar7 = d.super__Optional_base<char,_true,_true>._M_payload.
                        super__Optional_payload_base<char>._M_payload._M_value <
                        e1.super__Optional_base<int,_true,_true>._M_payload.
                        super__Optional_payload_base<int>._M_payload._M_value;
              }
            }
            else {
              bVar7 = false;
            }
            local_4cbc = CONCAT31(local_4cbc._1_3_,bVar7);
            local_4c78[0] = (allocator<char> *)&local_4cbc;
            lest::expression_lhs::operator_cast_to_result(&score,(expression_lhs *)local_4c78);
            if (score.passed == false) {
              local_4cf0 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_b70,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)local_4c78);
              std::__cxx11::string::string((string *)local_3568,local_b70);
              local_3568[0].line = 0x199;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_2198,"!(e1 <= d )",(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_b90,(string *)&score.decomposition);
              lest::failure::failure(local_4cf0,local_3568,local_2198,&local_b90);
              __cxa_throw(local_4cf0,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_21b8,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_42d0,local_21b8);
              local_42d0.line = 0x199;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_42f0,"!(e1 <= d )",&local_4cf1);
              std::__cxx11::string::string((string *)&local_21d8,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)local_4c78,&local_42d0,&local_42f0,&local_21d8,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_1b0,lest_env);
              lest::report(poVar1,(message *)local_4c78,&local_1b0);
              std::__cxx11::string::~string((string *)&local_1b0);
              lest::message::~message((message *)local_4c78);
              std::__cxx11::string::~string((string *)&local_21d8);
              std::__cxx11::string::~string((string *)&local_42f0);
              std::__cxx11::string::~string((string *)&local_42d0);
              std::__cxx11::string::~string(local_21b8);
            }
            ptVar6 = &score.decomposition;
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar4 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<char,_int,_long>::id410 = iVar5 + -1;
        iVar5 = iVar5 + 1;
      }
      if (relop<char,_int,_long>::id410 == iVar3) {
        uVar4 = 1;
        uVar2 = 0;
        while (uVar2 < uVar4) {
          ptVar6 = local_bd0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)ptVar6,"disengaged <= engaged",(allocator<char> *)local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,ptVar6);
          while( true ) {
            std::__cxx11::string::~string((string *)ptVar6);
            bVar7 = lest__ctx_section.once == false;
            lest__ctx_section.once = false;
            if (bVar7) break;
            local_4c78[0] = (allocator<char> *)&d;
            lest::expression_lhs<std::optional<char>const&>::operator<=
                      (&score,(expression_lhs<std::optional<char>const&> *)local_4c78,&e2);
            if (score.passed == false) {
              local_4cf0 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_bf0,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)local_4c78);
              std::__cxx11::string::string((string *)local_35b8,local_bf0);
              local_35b8[0].line = 0x19a;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_2218,"d <= e2",(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_c10,(string *)&score.decomposition);
              lest::failure::failure(local_4cf0,local_35b8,local_2218,&local_c10);
              __cxa_throw(local_4cf0,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_2238,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_4318,local_2238);
              local_4318.line = 0x19a;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4338,"d <= e2",&local_4cf1);
              std::__cxx11::string::string((string *)&local_2258,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)local_4c78,&local_4318,&local_4338,&local_2258,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_1d0,lest_env);
              lest::report(poVar1,(message *)local_4c78,&local_1d0);
              std::__cxx11::string::~string((string *)&local_1d0);
              lest::message::~message((message *)local_4c78);
              std::__cxx11::string::~string((string *)&local_2258);
              std::__cxx11::string::~string((string *)&local_4338);
              std::__cxx11::string::~string((string *)&local_4318);
              std::__cxx11::string::~string(local_2238);
            }
            ptVar6 = &score.decomposition;
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar4 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<char,_int,_long>::id412 = iVar5 + -1;
        iVar5 = iVar5 + 1;
      }
      if (relop<char,_int,_long>::id412 == iVar3) {
        uVar4 = 1;
        uVar2 = 0;
        while (uVar2 < uVar4) {
          ptVar6 = local_c50;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)ptVar6,"engaged    >  engaged",(allocator<char> *)local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,ptVar6);
          while( true ) {
            std::__cxx11::string::~string((string *)ptVar6);
            bVar7 = lest__ctx_section.once == false;
            lest__ctx_section.once = false;
            if (bVar7) break;
            local_4c78[0] = (allocator<char> *)&e2;
            lest::expression_lhs<std::optional<long>const&>::operator>
                      (&score,(expression_lhs<std::optional<long>const&> *)local_4c78,&e1);
            if (score.passed == false) {
              local_4cf0 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_c70,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)local_4c78);
              std::__cxx11::string::string((string *)local_3608,local_c70);
              local_3608[0].line = 0x19c;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_2298,"e2 > e1",(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_c90,(string *)&score.decomposition);
              lest::failure::failure(local_4cf0,local_3608,local_2298,&local_c90);
              __cxa_throw(local_4cf0,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_22b8,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_4360,local_22b8);
              local_4360.line = 0x19c;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4380,"e2 > e1",&local_4cf1);
              std::__cxx11::string::string((string *)&local_22d8,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)local_4c78,&local_4360,&local_4380,&local_22d8,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_1f0,lest_env);
              lest::report(poVar1,(message *)local_4c78,&local_1f0);
              std::__cxx11::string::~string((string *)&local_1f0);
              lest::message::~message((message *)local_4c78);
              std::__cxx11::string::~string((string *)&local_22d8);
              std::__cxx11::string::~string((string *)&local_4380);
              std::__cxx11::string::~string((string *)&local_4360);
              std::__cxx11::string::~string(local_22b8);
            }
            ptVar6 = &score.decomposition;
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar4 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<char,_int,_long>::id413 = iVar5 + -1;
        iVar5 = iVar5 + 1;
      }
      if (relop<char,_int,_long>::id413 == iVar3) {
        uVar4 = 1;
        uVar2 = 0;
        while (uVar2 < uVar4) {
          ptVar6 = local_cd0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)ptVar6,"engaged    >  disengaged",(allocator<char> *)local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,ptVar6);
          while( true ) {
            std::__cxx11::string::~string((string *)ptVar6);
            bVar7 = lest__ctx_section.once == false;
            lest__ctx_section.once = false;
            if (bVar7) break;
            local_4c78[0] = (allocator<char> *)&e2;
            lest::expression_lhs<std::optional<long>const&>::operator>
                      (&score,(expression_lhs<std::optional<long>const&> *)local_4c78,&d);
            if (score.passed == false) {
              local_4cf0 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_cf0,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)local_4c78);
              std::__cxx11::string::string((string *)local_3658,local_cf0);
              local_3658[0].line = 0x19d;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_2318,"e2 > d",(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_d10,(string *)&score.decomposition);
              lest::failure::failure(local_4cf0,local_3658,local_2318,&local_d10);
              __cxa_throw(local_4cf0,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_2338,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_43a8,local_2338);
              local_43a8.line = 0x19d;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_43c8,"e2 > d",&local_4cf1);
              std::__cxx11::string::string((string *)&local_2358,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)local_4c78,&local_43a8,&local_43c8,&local_2358,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_210,lest_env);
              lest::report(poVar1,(message *)local_4c78,&local_210);
              std::__cxx11::string::~string((string *)&local_210);
              lest::message::~message((message *)local_4c78);
              std::__cxx11::string::~string((string *)&local_2358);
              std::__cxx11::string::~string((string *)&local_43c8);
              std::__cxx11::string::~string((string *)&local_43a8);
              std::__cxx11::string::~string(local_2338);
            }
            ptVar6 = &score.decomposition;
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar4 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<char,_int,_long>::id414 = iVar5 + -1;
        iVar5 = iVar5 + 1;
      }
      if (relop<char,_int,_long>::id414 == iVar3) {
        uVar4 = 1;
        uVar2 = 0;
        while (uVar2 < uVar4) {
          ptVar6 = local_d50;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)ptVar6,"disengaged >  engaged",(allocator<char> *)local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,ptVar6);
          while( true ) {
            std::__cxx11::string::~string((string *)ptVar6);
            bVar7 = lest__ctx_section.once == false;
            lest__ctx_section.once = false;
            if (bVar7) break;
            bVar7 = true;
            if (d.super__Optional_base<char,_true,_true>._M_payload.
                super__Optional_payload_base<char>._M_engaged == true) {
              if (e1.super__Optional_base<int,_true,_true>._M_payload.
                  super__Optional_payload_base<int>._M_engaged == true) {
                bVar7 = d.super__Optional_base<char,_true,_true>._M_payload.
                        super__Optional_payload_base<char>._M_payload._M_value <=
                        e1.super__Optional_base<int,_true,_true>._M_payload.
                        super__Optional_payload_base<int>._M_payload._M_value;
              }
              else {
                bVar7 = false;
              }
            }
            local_4cbc = CONCAT31(local_4cbc._1_3_,bVar7);
            local_4c78[0] = (allocator<char> *)&local_4cbc;
            lest::expression_lhs::operator_cast_to_result(&score,(expression_lhs *)local_4c78);
            if (score.passed == false) {
              local_4cf0 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_d70,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)local_4c78);
              std::__cxx11::string::string((string *)local_36a8,local_d70);
              local_36a8[0].line = 0x19e;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_2398,"!(d > e1)",(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_d90,(string *)&score.decomposition);
              lest::failure::failure(local_4cf0,local_36a8,local_2398,&local_d90);
              __cxa_throw(local_4cf0,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_23b8,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_43f0,local_23b8);
              local_43f0.line = 0x19e;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4410,"!(d > e1)",&local_4cf1);
              std::__cxx11::string::string((string *)&local_23d8,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)local_4c78,&local_43f0,&local_4410,&local_23d8,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_230,lest_env);
              lest::report(poVar1,(message *)local_4c78,&local_230);
              std::__cxx11::string::~string((string *)&local_230);
              lest::message::~message((message *)local_4c78);
              std::__cxx11::string::~string((string *)&local_23d8);
              std::__cxx11::string::~string((string *)&local_4410);
              std::__cxx11::string::~string((string *)&local_43f0);
              std::__cxx11::string::~string(local_23b8);
            }
            ptVar6 = &score.decomposition;
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar4 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<char,_int,_long>::id416 = iVar5 + -1;
        iVar5 = iVar5 + 1;
      }
      if (relop<char,_int,_long>::id416 == iVar3) {
        uVar4 = 1;
        uVar2 = 0;
        while (uVar2 < uVar4) {
          ptVar6 = local_dd0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)ptVar6,"engaged    >= engaged",(allocator<char> *)local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,ptVar6);
          while( true ) {
            std::__cxx11::string::~string((string *)ptVar6);
            bVar7 = lest__ctx_section.once == false;
            lest__ctx_section.once = false;
            if (bVar7) break;
            local_4c78[0] = (allocator<char> *)&e1;
            lest::expression_lhs<std::optional<int>const&>::operator>=
                      (&score,(expression_lhs<std::optional<int>const&> *)local_4c78,
                       (optional<int> *)local_4c78[0]);
            if (score.passed == false) {
              local_4cf0 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_df0,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)local_4c78);
              std::__cxx11::string::string((string *)local_36f8,local_df0);
              local_36f8[0].line = 0x1a0;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_2418,"e1 >= e1",(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_e10,(string *)&score.decomposition);
              lest::failure::failure(local_4cf0,local_36f8,local_2418,&local_e10);
              __cxa_throw(local_4cf0,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_2438,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_4438,local_2438);
              local_4438.line = 0x1a0;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4458,"e1 >= e1",&local_4cf1);
              std::__cxx11::string::string((string *)&local_2458,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)local_4c78,&local_4438,&local_4458,&local_2458,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_250,lest_env);
              lest::report(poVar1,(message *)local_4c78,&local_250);
              std::__cxx11::string::~string((string *)&local_250);
              lest::message::~message((message *)local_4c78);
              std::__cxx11::string::~string((string *)&local_2458);
              std::__cxx11::string::~string((string *)&local_4458);
              std::__cxx11::string::~string((string *)&local_4438);
              std::__cxx11::string::~string(local_2438);
            }
            ptVar6 = &score.decomposition;
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar4 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<char,_int,_long>::id417 = iVar5 + -1;
        iVar5 = iVar5 + 1;
      }
      if (relop<char,_int,_long>::id417 == iVar3) {
        uVar4 = 1;
        uVar2 = 0;
        while (uVar2 < uVar4) {
          ptVar6 = local_e50;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)ptVar6,"engaged    >= engaged",(allocator<char> *)local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,ptVar6);
          while( true ) {
            std::__cxx11::string::~string((string *)ptVar6);
            bVar7 = lest__ctx_section.once == false;
            lest__ctx_section.once = false;
            if (bVar7) break;
            local_4c78[0] = (allocator<char> *)&e2;
            lest::expression_lhs<std::optional<long>const&>::operator>=
                      (&score,(expression_lhs<std::optional<long>const&> *)local_4c78,&e1);
            if (score.passed == false) {
              local_4cf0 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_e70,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)local_4c78);
              std::__cxx11::string::string((string *)local_3748,local_e70);
              local_3748[0].line = 0x1a1;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_2498,"e2 >= e1",(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_e90,(string *)&score.decomposition);
              lest::failure::failure(local_4cf0,local_3748,local_2498,&local_e90);
              __cxa_throw(local_4cf0,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_24b8,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_4480,local_24b8);
              local_4480.line = 0x1a1;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_44a0,"e2 >= e1",&local_4cf1);
              std::__cxx11::string::string((string *)&local_24d8,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)local_4c78,&local_4480,&local_44a0,&local_24d8,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_270,lest_env);
              lest::report(poVar1,(message *)local_4c78,&local_270);
              std::__cxx11::string::~string((string *)&local_270);
              lest::message::~message((message *)local_4c78);
              std::__cxx11::string::~string((string *)&local_24d8);
              std::__cxx11::string::~string((string *)&local_44a0);
              std::__cxx11::string::~string((string *)&local_4480);
              std::__cxx11::string::~string(local_24b8);
            }
            ptVar6 = &score.decomposition;
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar4 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<char,_int,_long>::id418 = iVar5 + -1;
        iVar5 = iVar5 + 1;
      }
      if (relop<char,_int,_long>::id418 == iVar3) {
        uVar4 = 1;
        uVar2 = 0;
        while (uVar2 < uVar4) {
          ptVar6 = local_ed0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)ptVar6,"engaged    >= disengaged",(allocator<char> *)local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,ptVar6);
          while( true ) {
            std::__cxx11::string::~string((string *)ptVar6);
            bVar7 = lest__ctx_section.once == false;
            lest__ctx_section.once = false;
            if (bVar7) break;
            local_4c78[0] = (allocator<char> *)&e2;
            lest::expression_lhs<std::optional<long>const&>::operator>=
                      (&score,(expression_lhs<std::optional<long>const&> *)local_4c78,&d);
            if (score.passed == false) {
              local_4cf0 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_ef0,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)local_4c78);
              std::__cxx11::string::string((string *)local_3798,local_ef0);
              local_3798[0].line = 0x1a2;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_2518,"e2 >= d",(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_f10,(string *)&score.decomposition);
              lest::failure::failure(local_4cf0,local_3798,local_2518,&local_f10);
              __cxa_throw(local_4cf0,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_2538,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_44c8,local_2538);
              local_44c8.line = 0x1a2;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_44e8,"e2 >= d",&local_4cf1);
              std::__cxx11::string::string((string *)&local_2558,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)local_4c78,&local_44c8,&local_44e8,&local_2558,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_290,lest_env);
              lest::report(poVar1,(message *)local_4c78,&local_290);
              std::__cxx11::string::~string((string *)&local_290);
              lest::message::~message((message *)local_4c78);
              std::__cxx11::string::~string((string *)&local_2558);
              std::__cxx11::string::~string((string *)&local_44e8);
              std::__cxx11::string::~string((string *)&local_44c8);
              std::__cxx11::string::~string(local_2538);
            }
            ptVar6 = &score.decomposition;
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar4 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<char,_int,_long>::id419 = iVar5 + -1;
        iVar5 = iVar5 + 1;
      }
      if (relop<char,_int,_long>::id419 == iVar3) {
        uVar4 = 1;
        uVar2 = 0;
        while (uVar2 < uVar4) {
          ptVar6 = local_f50;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)ptVar6,"disengaged >= engaged",(allocator<char> *)local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,ptVar6);
          while( true ) {
            std::__cxx11::string::~string((string *)ptVar6);
            bVar7 = lest__ctx_section.once == false;
            lest__ctx_section.once = false;
            if (bVar7) break;
            if (e1.super__Optional_base<int,_true,_true>._M_payload.
                super__Optional_payload_base<int>._M_engaged == true) {
              bVar7 = true;
              if (d.super__Optional_base<char,_true,_true>._M_payload.
                  super__Optional_payload_base<char>._M_engaged == true) {
                bVar7 = d.super__Optional_base<char,_true,_true>._M_payload.
                        super__Optional_payload_base<char>._M_payload._M_value <
                        e1.super__Optional_base<int,_true,_true>._M_payload.
                        super__Optional_payload_base<int>._M_payload._M_value;
              }
            }
            else {
              bVar7 = false;
            }
            local_4cbc = CONCAT31(local_4cbc._1_3_,bVar7);
            local_4c78[0] = (allocator<char> *)&local_4cbc;
            lest::expression_lhs::operator_cast_to_result(&score,(expression_lhs *)local_4c78);
            if (score.passed == false) {
              local_4cf0 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_f70,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)local_4c78);
              std::__cxx11::string::string((string *)local_37e8,local_f70);
              local_37e8[0].line = 0x1a3;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_2598,"!(d >= e1)",(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_f90,(string *)&score.decomposition);
              lest::failure::failure(local_4cf0,local_37e8,local_2598,&local_f90);
              __cxa_throw(local_4cf0,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_25b8,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_4510,local_25b8);
              local_4510.line = 0x1a3;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4530,"!(d >= e1)",&local_4cf1);
              std::__cxx11::string::string((string *)&local_25d8,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)local_4c78,&local_4510,&local_4530,&local_25d8,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_2b0,lest_env);
              lest::report(poVar1,(message *)local_4c78,&local_2b0);
              std::__cxx11::string::~string((string *)&local_2b0);
              lest::message::~message((message *)local_4c78);
              std::__cxx11::string::~string((string *)&local_25d8);
              std::__cxx11::string::~string((string *)&local_4530);
              std::__cxx11::string::~string((string *)&local_4510);
              std::__cxx11::string::~string(local_25b8);
            }
            ptVar6 = &score.decomposition;
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar4 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<char,_int,_long>::id421 = iVar5 + -1;
        iVar5 = iVar5 + 1;
      }
      if (relop<char,_int,_long>::id421 == iVar3) {
        uVar4 = 1;
        uVar2 = 0;
        while (uVar2 < uVar4) {
          ptVar6 = local_fd0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)ptVar6,"disengaged == nullopt",(allocator<char> *)local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,ptVar6);
          while( true ) {
            std::__cxx11::string::~string((string *)ptVar6);
            bVar7 = lest__ctx_section.once == false;
            lest__ctx_section.once = false;
            if (bVar7) break;
            local_4cbc = CONCAT31(local_4cbc._1_3_,
                                  d.super__Optional_base<char,_true,_true>._M_payload.
                                  super__Optional_payload_base<char>._M_engaged) ^ 1;
            local_4c78[0] = (allocator<char> *)&local_4cbc;
            lest::expression_lhs::operator_cast_to_result(&score,(expression_lhs *)local_4c78);
            if (score.passed == false) {
              local_4cf0 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_ff0,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)local_4c78);
              std::__cxx11::string::string((string *)local_3838,local_ff0);
              local_3838[0].line = 0x1a5;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_2618,"(d == nullopt)",(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_1010,(string *)&score.decomposition);
              lest::failure::failure(local_4cf0,local_3838,local_2618,&local_1010);
              __cxa_throw(local_4cf0,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_2638,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_4558,local_2638);
              local_4558.line = 0x1a5;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4578,"(d == nullopt)",&local_4cf1);
              std::__cxx11::string::string((string *)&local_2658,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)local_4c78,&local_4558,&local_4578,&local_2658,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_2d0,lest_env);
              lest::report(poVar1,(message *)local_4c78,&local_2d0);
              std::__cxx11::string::~string((string *)&local_2d0);
              lest::message::~message((message *)local_4c78);
              std::__cxx11::string::~string((string *)&local_2658);
              std::__cxx11::string::~string((string *)&local_4578);
              std::__cxx11::string::~string((string *)&local_4558);
              std::__cxx11::string::~string(local_2638);
            }
            ptVar6 = &score.decomposition;
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar4 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<char,_int,_long>::id422 = iVar5 + -1;
        iVar5 = iVar5 + 1;
      }
      if (relop<char,_int,_long>::id422 == iVar3) {
        uVar4 = 1;
        uVar2 = 0;
        while (uVar2 < uVar4) {
          ptVar6 = local_1050;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)ptVar6,"nullopt    == disengaged",(allocator<char> *)local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,ptVar6);
          while( true ) {
            std::__cxx11::string::~string((string *)ptVar6);
            bVar7 = lest__ctx_section.once == false;
            lest__ctx_section.once = false;
            if (bVar7) break;
            local_4cbc = CONCAT31(local_4cbc._1_3_,
                                  d.super__Optional_base<char,_true,_true>._M_payload.
                                  super__Optional_payload_base<char>._M_engaged) ^ 1;
            local_4c78[0] = (allocator<char> *)&local_4cbc;
            lest::expression_lhs::operator_cast_to_result(&score,(expression_lhs *)local_4c78);
            if (score.passed == false) {
              local_4cf0 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_1070,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)local_4c78);
              std::__cxx11::string::string((string *)local_3888,local_1070);
              local_3888[0].line = 0x1a6;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_2698,"(nullopt == d )",(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_1090,(string *)&score.decomposition);
              lest::failure::failure(local_4cf0,local_3888,local_2698,&local_1090);
              __cxa_throw(local_4cf0,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_26b8,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_45a0,local_26b8);
              local_45a0.line = 0x1a6;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_45c0,"(nullopt == d )",&local_4cf1);
              std::__cxx11::string::string((string *)&local_26d8,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)local_4c78,&local_45a0,&local_45c0,&local_26d8,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_2f0,lest_env);
              lest::report(poVar1,(message *)local_4c78,&local_2f0);
              std::__cxx11::string::~string((string *)&local_2f0);
              lest::message::~message((message *)local_4c78);
              std::__cxx11::string::~string((string *)&local_26d8);
              std::__cxx11::string::~string((string *)&local_45c0);
              std::__cxx11::string::~string((string *)&local_45a0);
              std::__cxx11::string::~string(local_26b8);
            }
            ptVar6 = &score.decomposition;
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar4 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<char,_int,_long>::id423 = iVar5 + -1;
        iVar5 = iVar5 + 1;
      }
      if (relop<char,_int,_long>::id423 == iVar3) {
        uVar4 = 1;
        uVar2 = 0;
        while (uVar2 < uVar4) {
          ptVar6 = local_10d0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)ptVar6,"engaged    == nullopt",(allocator<char> *)local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,ptVar6);
          while( true ) {
            std::__cxx11::string::~string((string *)ptVar6);
            bVar7 = lest__ctx_section.once == false;
            lest__ctx_section.once = false;
            if (bVar7) break;
            local_4cbc = CONCAT31(local_4cbc._1_3_,
                                  e1.super__Optional_base<int,_true,_true>._M_payload.
                                  super__Optional_payload_base<int>._M_engaged);
            local_4c78[0] = (allocator<char> *)&local_4cbc;
            lest::expression_lhs::operator_cast_to_result(&score,(expression_lhs *)local_4c78);
            if (score.passed == false) {
              local_4cf0 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_10f0,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)local_4c78);
              std::__cxx11::string::string((string *)local_38d8,local_10f0);
              local_38d8[0].line = 0x1a7;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_2718,"(e1 != nullopt)",(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_1110,(string *)&score.decomposition);
              lest::failure::failure(local_4cf0,local_38d8,local_2718,&local_1110);
              __cxa_throw(local_4cf0,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_2738,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_45e8,local_2738);
              local_45e8.line = 0x1a7;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4608,"(e1 != nullopt)",&local_4cf1);
              std::__cxx11::string::string((string *)&local_2758,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)local_4c78,&local_45e8,&local_4608,&local_2758,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_310,lest_env);
              lest::report(poVar1,(message *)local_4c78,&local_310);
              std::__cxx11::string::~string((string *)&local_310);
              lest::message::~message((message *)local_4c78);
              std::__cxx11::string::~string((string *)&local_2758);
              std::__cxx11::string::~string((string *)&local_4608);
              std::__cxx11::string::~string((string *)&local_45e8);
              std::__cxx11::string::~string(local_2738);
            }
            ptVar6 = &score.decomposition;
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar4 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<char,_int,_long>::id424 = iVar5 + -1;
        iVar5 = iVar5 + 1;
      }
      if (relop<char,_int,_long>::id424 == iVar3) {
        uVar4 = 1;
        uVar2 = 0;
        while (uVar2 < uVar4) {
          ptVar6 = local_1150;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)ptVar6,"nullopt    == engaged",(allocator<char> *)local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,ptVar6);
          while( true ) {
            std::__cxx11::string::~string((string *)ptVar6);
            bVar7 = lest__ctx_section.once == false;
            lest__ctx_section.once = false;
            if (bVar7) break;
            local_4cbc = CONCAT31(local_4cbc._1_3_,
                                  e1.super__Optional_base<int,_true,_true>._M_payload.
                                  super__Optional_payload_base<int>._M_engaged);
            local_4c78[0] = (allocator<char> *)&local_4cbc;
            lest::expression_lhs::operator_cast_to_result(&score,(expression_lhs *)local_4c78);
            if (score.passed == false) {
              local_4cf0 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_1170,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)local_4c78);
              std::__cxx11::string::string((string *)local_3928,local_1170);
              local_3928[0].line = 0x1a8;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_2798,"(nullopt != e1 )",(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_1190,(string *)&score.decomposition);
              lest::failure::failure(local_4cf0,local_3928,local_2798,&local_1190);
              __cxa_throw(local_4cf0,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_27b8,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_4630,local_27b8);
              local_4630.line = 0x1a8;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4650,"(nullopt != e1 )",&local_4cf1);
              std::__cxx11::string::string((string *)&local_27d8,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)local_4c78,&local_4630,&local_4650,&local_27d8,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_330,lest_env);
              lest::report(poVar1,(message *)local_4c78,&local_330);
              std::__cxx11::string::~string((string *)&local_330);
              lest::message::~message((message *)local_4c78);
              std::__cxx11::string::~string((string *)&local_27d8);
              std::__cxx11::string::~string((string *)&local_4650);
              std::__cxx11::string::~string((string *)&local_4630);
              std::__cxx11::string::~string(local_27b8);
            }
            ptVar6 = &score.decomposition;
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar4 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<char,_int,_long>::id425 = iVar5 + -1;
        iVar5 = iVar5 + 1;
      }
      if (relop<char,_int,_long>::id425 == iVar3) {
        uVar4 = 1;
        uVar2 = 0;
        while (uVar2 < uVar4) {
          ptVar6 = local_11d0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)ptVar6,"disengaged == nullopt",(allocator<char> *)local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,ptVar6);
          while( true ) {
            std::__cxx11::string::~string((string *)ptVar6);
            bVar7 = lest__ctx_section.once == false;
            lest__ctx_section.once = false;
            if (bVar7) break;
            local_4cbc = CONCAT31(local_4cbc._1_3_,1);
            local_4c78[0] = (allocator<char> *)&local_4cbc;
            lest::expression_lhs::operator_cast_to_result(&score,(expression_lhs *)local_4c78);
            if (score.passed == false) {
              local_4cf0 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_11f0,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)local_4c78);
              std::__cxx11::string::string((string *)local_3978,local_11f0);
              local_3978[0].line = 0x1a9;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_2818,"!(d < nullopt)",(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_1210,(string *)&score.decomposition);
              lest::failure::failure(local_4cf0,local_3978,local_2818,&local_1210);
              __cxa_throw(local_4cf0,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_2838,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_4678,local_2838);
              local_4678.line = 0x1a9;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4698,"!(d < nullopt)",&local_4cf1);
              std::__cxx11::string::string((string *)&local_2858,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)local_4c78,&local_4678,&local_4698,&local_2858,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_350,lest_env);
              lest::report(poVar1,(message *)local_4c78,&local_350);
              std::__cxx11::string::~string((string *)&local_350);
              lest::message::~message((message *)local_4c78);
              std::__cxx11::string::~string((string *)&local_2858);
              std::__cxx11::string::~string((string *)&local_4698);
              std::__cxx11::string::~string((string *)&local_4678);
              std::__cxx11::string::~string(local_2838);
            }
            ptVar6 = &score.decomposition;
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar4 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<char,_int,_long>::id426 = iVar5 + -1;
        iVar5 = iVar5 + 1;
      }
      if (relop<char,_int,_long>::id426 == iVar3) {
        uVar4 = 1;
        uVar2 = 0;
        while (uVar2 < uVar4) {
          ptVar6 = local_1250;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)ptVar6,"nullopt    == disengaged",(allocator<char> *)local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,ptVar6);
          while( true ) {
            std::__cxx11::string::~string((string *)ptVar6);
            bVar7 = lest__ctx_section.once == false;
            lest__ctx_section.once = false;
            if (bVar7) break;
            local_4cbc = CONCAT31(local_4cbc._1_3_,
                                  d.super__Optional_base<char,_true,_true>._M_payload.
                                  super__Optional_payload_base<char>._M_engaged) ^ 1;
            local_4c78[0] = (allocator<char> *)&local_4cbc;
            lest::expression_lhs::operator_cast_to_result(&score,(expression_lhs *)local_4c78);
            if (score.passed == false) {
              local_4cf0 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_1270,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)local_4c78);
              std::__cxx11::string::string((string *)local_39c8,local_1270);
              local_39c8[0].line = 0x1aa;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_2898,"!(nullopt < d )",(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_1290,(string *)&score.decomposition);
              lest::failure::failure(local_4cf0,local_39c8,local_2898,&local_1290);
              __cxa_throw(local_4cf0,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_28b8,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_46c0,local_28b8);
              local_46c0.line = 0x1aa;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_46e0,"!(nullopt < d )",&local_4cf1);
              std::__cxx11::string::string((string *)&local_28d8,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)local_4c78,&local_46c0,&local_46e0,&local_28d8,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_370,lest_env);
              lest::report(poVar1,(message *)local_4c78,&local_370);
              std::__cxx11::string::~string((string *)&local_370);
              lest::message::~message((message *)local_4c78);
              std::__cxx11::string::~string((string *)&local_28d8);
              std::__cxx11::string::~string((string *)&local_46e0);
              std::__cxx11::string::~string((string *)&local_46c0);
              std::__cxx11::string::~string(local_28b8);
            }
            ptVar6 = &score.decomposition;
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar4 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<char,_int,_long>::id427 = iVar5 + -1;
        iVar5 = iVar5 + 1;
      }
      if (relop<char,_int,_long>::id427 == iVar3) {
        uVar4 = 1;
        uVar2 = 0;
        while (uVar2 < uVar4) {
          ptVar6 = local_12d0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)ptVar6,"disengaged == nullopt",(allocator<char> *)local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,ptVar6);
          while( true ) {
            std::__cxx11::string::~string((string *)ptVar6);
            bVar7 = lest__ctx_section.once == false;
            lest__ctx_section.once = false;
            if (bVar7) break;
            local_4cbc = CONCAT31(local_4cbc._1_3_,
                                  d.super__Optional_base<char,_true,_true>._M_payload.
                                  super__Optional_payload_base<char>._M_engaged) ^ 1;
            local_4c78[0] = (allocator<char> *)&local_4cbc;
            lest::expression_lhs::operator_cast_to_result(&score,(expression_lhs *)local_4c78);
            if (score.passed == false) {
              local_4cf0 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_12f0,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)local_4c78);
              std::__cxx11::string::string((string *)local_3a18,local_12f0);
              local_3a18[0].line = 0x1ab;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_2918,"(d <= nullopt)",(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_1310,(string *)&score.decomposition);
              lest::failure::failure(local_4cf0,local_3a18,local_2918,&local_1310);
              __cxa_throw(local_4cf0,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_2938,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_4708,local_2938);
              local_4708.line = 0x1ab;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4728,"(d <= nullopt)",&local_4cf1);
              std::__cxx11::string::string((string *)&local_2958,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)local_4c78,&local_4708,&local_4728,&local_2958,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_390,lest_env);
              lest::report(poVar1,(message *)local_4c78,&local_390);
              std::__cxx11::string::~string((string *)&local_390);
              lest::message::~message((message *)local_4c78);
              std::__cxx11::string::~string((string *)&local_2958);
              std::__cxx11::string::~string((string *)&local_4728);
              std::__cxx11::string::~string((string *)&local_4708);
              std::__cxx11::string::~string(local_2938);
            }
            ptVar6 = &score.decomposition;
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar4 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<char,_int,_long>::id428 = iVar5 + -1;
        iVar5 = iVar5 + 1;
      }
      if (relop<char,_int,_long>::id428 == iVar3) {
        uVar4 = 1;
        uVar2 = 0;
        while (uVar2 < uVar4) {
          ptVar6 = local_1350;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)ptVar6,"nullopt    == disengaged",(allocator<char> *)local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,ptVar6);
          while( true ) {
            std::__cxx11::string::~string((string *)ptVar6);
            bVar7 = lest__ctx_section.once == false;
            lest__ctx_section.once = false;
            if (bVar7) break;
            local_4cbc = CONCAT31(local_4cbc._1_3_,1);
            local_4c78[0] = (allocator<char> *)&local_4cbc;
            lest::expression_lhs::operator_cast_to_result(&score,(expression_lhs *)local_4c78);
            if (score.passed == false) {
              local_4cf0 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_1370,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)local_4c78);
              std::__cxx11::string::string((string *)local_3a68,local_1370);
              local_3a68[0].line = 0x1ac;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_2998,"(nullopt <= d )",(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_1390,(string *)&score.decomposition);
              lest::failure::failure(local_4cf0,local_3a68,local_2998,&local_1390);
              __cxa_throw(local_4cf0,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_29b8,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_4750,local_29b8);
              local_4750.line = 0x1ac;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4770,"(nullopt <= d )",&local_4cf1);
              std::__cxx11::string::string((string *)&local_29d8,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)local_4c78,&local_4750,&local_4770,&local_29d8,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_3b0,lest_env);
              lest::report(poVar1,(message *)local_4c78,&local_3b0);
              std::__cxx11::string::~string((string *)&local_3b0);
              lest::message::~message((message *)local_4c78);
              std::__cxx11::string::~string((string *)&local_29d8);
              std::__cxx11::string::~string((string *)&local_4770);
              std::__cxx11::string::~string((string *)&local_4750);
              std::__cxx11::string::~string(local_29b8);
            }
            ptVar6 = &score.decomposition;
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar4 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<char,_int,_long>::id429 = iVar5 + -1;
        iVar5 = iVar5 + 1;
      }
      if (relop<char,_int,_long>::id429 == iVar3) {
        uVar4 = 1;
        uVar2 = 0;
        while (uVar2 < uVar4) {
          ptVar6 = local_13d0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)ptVar6,"disengaged == nullopt",(allocator<char> *)local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,ptVar6);
          while( true ) {
            std::__cxx11::string::~string((string *)ptVar6);
            bVar7 = lest__ctx_section.once == false;
            lest__ctx_section.once = false;
            if (bVar7) break;
            local_4cbc = CONCAT31(local_4cbc._1_3_,
                                  d.super__Optional_base<char,_true,_true>._M_payload.
                                  super__Optional_payload_base<char>._M_engaged) ^ 1;
            local_4c78[0] = (allocator<char> *)&local_4cbc;
            lest::expression_lhs::operator_cast_to_result(&score,(expression_lhs *)local_4c78);
            if (score.passed == false) {
              local_4cf0 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_13f0,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)local_4c78);
              std::__cxx11::string::string((string *)local_3ab8,local_13f0);
              local_3ab8[0].line = 0x1ad;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_2a18,"!(d > nullopt)",(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_1410,(string *)&score.decomposition);
              lest::failure::failure(local_4cf0,local_3ab8,local_2a18,&local_1410);
              __cxa_throw(local_4cf0,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_2a38,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_4798,local_2a38);
              local_4798.line = 0x1ad;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_47b8,"!(d > nullopt)",&local_4cf1);
              std::__cxx11::string::string((string *)&local_2a58,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)local_4c78,&local_4798,&local_47b8,&local_2a58,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_3d0,lest_env);
              lest::report(poVar1,(message *)local_4c78,&local_3d0);
              std::__cxx11::string::~string((string *)&local_3d0);
              lest::message::~message((message *)local_4c78);
              std::__cxx11::string::~string((string *)&local_2a58);
              std::__cxx11::string::~string((string *)&local_47b8);
              std::__cxx11::string::~string((string *)&local_4798);
              std::__cxx11::string::~string(local_2a38);
            }
            ptVar6 = &score.decomposition;
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar4 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<char,_int,_long>::id430 = iVar5 + -1;
        iVar5 = iVar5 + 1;
      }
      if (relop<char,_int,_long>::id430 == iVar3) {
        uVar4 = 1;
        uVar2 = 0;
        while (uVar2 < uVar4) {
          ptVar6 = local_1450;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)ptVar6,"nullopt    == disengaged",(allocator<char> *)local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,ptVar6);
          while( true ) {
            std::__cxx11::string::~string((string *)ptVar6);
            bVar7 = lest__ctx_section.once == false;
            lest__ctx_section.once = false;
            if (bVar7) break;
            local_4cbc = CONCAT31(local_4cbc._1_3_,1);
            local_4c78[0] = (allocator<char> *)&local_4cbc;
            lest::expression_lhs::operator_cast_to_result(&score,(expression_lhs *)local_4c78);
            if (score.passed == false) {
              local_4cf0 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_1470,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)local_4c78);
              std::__cxx11::string::string((string *)local_3b08,local_1470);
              local_3b08[0].line = 0x1ae;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_2a98,"!(nullopt > d )",(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_1490,(string *)&score.decomposition);
              lest::failure::failure(local_4cf0,local_3b08,local_2a98,&local_1490);
              __cxa_throw(local_4cf0,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_2ab8,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_47e0,local_2ab8);
              local_47e0.line = 0x1ae;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4800,"!(nullopt > d )",&local_4cf1);
              std::__cxx11::string::string((string *)&local_2ad8,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)local_4c78,&local_47e0,&local_4800,&local_2ad8,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_3f0,lest_env);
              lest::report(poVar1,(message *)local_4c78,&local_3f0);
              std::__cxx11::string::~string((string *)&local_3f0);
              lest::message::~message((message *)local_4c78);
              std::__cxx11::string::~string((string *)&local_2ad8);
              std::__cxx11::string::~string((string *)&local_4800);
              std::__cxx11::string::~string((string *)&local_47e0);
              std::__cxx11::string::~string(local_2ab8);
            }
            ptVar6 = &score.decomposition;
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar4 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<char,_int,_long>::id431 = iVar5 + -1;
        iVar5 = iVar5 + 1;
      }
      if (relop<char,_int,_long>::id431 == iVar3) {
        uVar4 = 1;
        uVar2 = 0;
        while (uVar2 < uVar4) {
          ptVar6 = local_14d0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)ptVar6,"disengaged == nullopt",(allocator<char> *)local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,ptVar6);
          while( true ) {
            std::__cxx11::string::~string((string *)ptVar6);
            bVar7 = lest__ctx_section.once == false;
            lest__ctx_section.once = false;
            if (bVar7) break;
            local_4cbc = CONCAT31(local_4cbc._1_3_,1);
            local_4c78[0] = (allocator<char> *)&local_4cbc;
            lest::expression_lhs::operator_cast_to_result(&score,(expression_lhs *)local_4c78);
            if (score.passed == false) {
              local_4cf0 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_14f0,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)local_4c78);
              std::__cxx11::string::string((string *)local_3b58,local_14f0);
              local_3b58[0].line = 0x1af;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_2b18,"(d >= nullopt)",(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_1510,(string *)&score.decomposition);
              lest::failure::failure(local_4cf0,local_3b58,local_2b18,&local_1510);
              __cxa_throw(local_4cf0,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_2b38,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_4828,local_2b38);
              local_4828.line = 0x1af;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4848,"(d >= nullopt)",&local_4cf1);
              std::__cxx11::string::string((string *)&local_2b58,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)local_4c78,&local_4828,&local_4848,&local_2b58,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_410,lest_env);
              lest::report(poVar1,(message *)local_4c78,&local_410);
              std::__cxx11::string::~string((string *)&local_410);
              lest::message::~message((message *)local_4c78);
              std::__cxx11::string::~string((string *)&local_2b58);
              std::__cxx11::string::~string((string *)&local_4848);
              std::__cxx11::string::~string((string *)&local_4828);
              std::__cxx11::string::~string(local_2b38);
            }
            ptVar6 = &score.decomposition;
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar4 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<char,_int,_long>::id432 = iVar5 + -1;
        iVar5 = iVar5 + 1;
      }
      if (relop<char,_int,_long>::id432 == iVar3) {
        uVar4 = 1;
        uVar2 = 0;
        while (uVar2 < uVar4) {
          ptVar6 = local_1550;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)ptVar6,"nullopt    == disengaged",(allocator<char> *)local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,ptVar6);
          while( true ) {
            std::__cxx11::string::~string((string *)ptVar6);
            bVar7 = lest__ctx_section.once == false;
            lest__ctx_section.once = false;
            if (bVar7) break;
            local_4cbc = CONCAT31(local_4cbc._1_3_,
                                  d.super__Optional_base<char,_true,_true>._M_payload.
                                  super__Optional_payload_base<char>._M_engaged) ^ 1;
            local_4c78[0] = (allocator<char> *)&local_4cbc;
            lest::expression_lhs::operator_cast_to_result(&score,(expression_lhs *)local_4c78);
            if (score.passed == false) {
              local_4cf0 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_1570,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)local_4c78);
              std::__cxx11::string::string((string *)local_3ba8,local_1570);
              local_3ba8[0].line = 0x1b0;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_2b98,"(nullopt >= d )",(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_1590,(string *)&score.decomposition);
              lest::failure::failure(local_4cf0,local_3ba8,local_2b98,&local_1590);
              __cxa_throw(local_4cf0,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_2bb8,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_4870,local_2bb8);
              local_4870.line = 0x1b0;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4890,"(nullopt >= d )",&local_4cf1);
              std::__cxx11::string::string((string *)&local_2bd8,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)local_4c78,&local_4870,&local_4890,&local_2bd8,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_430,lest_env);
              lest::report(poVar1,(message *)local_4c78,&local_430);
              std::__cxx11::string::~string((string *)&local_430);
              lest::message::~message((message *)local_4c78);
              std::__cxx11::string::~string((string *)&local_2bd8);
              std::__cxx11::string::~string((string *)&local_4890);
              std::__cxx11::string::~string((string *)&local_4870);
              std::__cxx11::string::~string(local_2bb8);
            }
            ptVar6 = &score.decomposition;
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar4 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<char,_int,_long>::id434 = iVar5 + -1;
        iVar5 = iVar5 + 1;
      }
      if (relop<char,_int,_long>::id434 == iVar3) {
        uVar4 = 1;
        uVar2 = 0;
        while (uVar2 < uVar4) {
          ptVar6 = local_15d0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)ptVar6,"engaged    == value",(allocator<char> *)local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,ptVar6);
          while( true ) {
            std::__cxx11::string::~string((string *)ptVar6);
            bVar7 = lest__ctx_section.once == false;
            lest__ctx_section.once = false;
            if (bVar7) break;
            local_4c78[0] = (allocator<char> *)&e1;
            local_4cbc = 6;
            lest::expression_lhs<std::optional<int>const&>::operator==
                      (&score,(expression_lhs<std::optional<int>const&> *)local_4c78,
                       (int *)&local_4cbc);
            if (score.passed == false) {
              local_4cf0 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_15f0,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)local_4c78);
              std::__cxx11::string::string((string *)local_3bf8,local_15f0);
              local_3bf8[0].line = 0x1b2;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_2c18,"e1 == 6",(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_1610,(string *)&score.decomposition);
              lest::failure::failure(local_4cf0,local_3bf8,local_2c18,&local_1610);
              __cxa_throw(local_4cf0,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_2c38,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_48b8,local_2c38);
              local_48b8.line = 0x1b2;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_48d8,"e1 == 6",&local_4cf1);
              std::__cxx11::string::string((string *)&local_2c58,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)local_4c78,&local_48b8,&local_48d8,&local_2c58,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_450,lest_env);
              lest::report(poVar1,(message *)local_4c78,&local_450);
              std::__cxx11::string::~string((string *)&local_450);
              lest::message::~message((message *)local_4c78);
              std::__cxx11::string::~string((string *)&local_2c58);
              std::__cxx11::string::~string((string *)&local_48d8);
              std::__cxx11::string::~string((string *)&local_48b8);
              std::__cxx11::string::~string(local_2c38);
            }
            ptVar6 = &score.decomposition;
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar4 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<char,_int,_long>::id435 = iVar5 + -1;
        iVar5 = iVar5 + 1;
      }
      if (relop<char,_int,_long>::id435 == iVar3) {
        uVar4 = 1;
        uVar2 = 0;
        while (uVar2 < uVar4) {
          ptVar6 = local_1650;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)ptVar6,"value     == engaged",(allocator<char> *)local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,ptVar6);
          while( true ) {
            std::__cxx11::string::~string((string *)ptVar6);
            bVar7 = lest__ctx_section.once == false;
            lest__ctx_section.once = false;
            if (bVar7) break;
            local_4cbc = 6;
            local_4c78[0] = (allocator<char> *)&local_4cbc;
            lest::expression_lhs<int_const&>::operator==
                      (&score,(expression_lhs<int_const&> *)local_4c78,&e1);
            if (score.passed == false) {
              local_4cf0 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_1670,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)local_4c78);
              std::__cxx11::string::string((string *)local_3c48,local_1670);
              local_3c48[0].line = 0x1b3;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_2c98,"6 == e1",(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_1690,(string *)&score.decomposition);
              lest::failure::failure(local_4cf0,local_3c48,local_2c98,&local_1690);
              __cxa_throw(local_4cf0,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_2cb8,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_4900,local_2cb8);
              local_4900.line = 0x1b3;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4920,"6 == e1",&local_4cf1);
              std::__cxx11::string::string((string *)&local_2cd8,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)local_4c78,&local_4900,&local_4920,&local_2cd8,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_470,lest_env);
              lest::report(poVar1,(message *)local_4c78,&local_470);
              std::__cxx11::string::~string((string *)&local_470);
              lest::message::~message((message *)local_4c78);
              std::__cxx11::string::~string((string *)&local_2cd8);
              std::__cxx11::string::~string((string *)&local_4920);
              std::__cxx11::string::~string((string *)&local_4900);
              std::__cxx11::string::~string(local_2cb8);
            }
            ptVar6 = &score.decomposition;
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar4 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<char,_int,_long>::id436 = iVar5 + -1;
        iVar5 = iVar5 + 1;
      }
      if (relop<char,_int,_long>::id436 == iVar3) {
        uVar4 = 1;
        uVar2 = 0;
        while (uVar2 < uVar4) {
          ptVar6 = local_16d0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)ptVar6,"engaged   != value",(allocator<char> *)local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,ptVar6);
          while( true ) {
            std::__cxx11::string::~string((string *)ptVar6);
            bVar7 = lest__ctx_section.once == false;
            lest__ctx_section.once = false;
            if (bVar7) break;
            local_4c78[0] = (allocator<char> *)&e1;
            local_4cbc = 7;
            lest::expression_lhs<std::optional<int>const&>::operator!=
                      (&score,(expression_lhs<std::optional<int>const&> *)local_4c78,
                       (int *)&local_4cbc);
            if (score.passed == false) {
              local_4cf0 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_16f0,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)local_4c78);
              std::__cxx11::string::string((string *)local_3c98,local_16f0);
              local_3c98[0].line = 0x1b4;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_2d18,"e1 != 7",(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_1710,(string *)&score.decomposition);
              lest::failure::failure(local_4cf0,local_3c98,local_2d18,&local_1710);
              __cxa_throw(local_4cf0,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_2d38,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_4948,local_2d38);
              local_4948.line = 0x1b4;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4968,"e1 != 7",&local_4cf1);
              std::__cxx11::string::string((string *)&local_2d58,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)local_4c78,&local_4948,&local_4968,&local_2d58,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_490,lest_env);
              lest::report(poVar1,(message *)local_4c78,&local_490);
              std::__cxx11::string::~string((string *)&local_490);
              lest::message::~message((message *)local_4c78);
              std::__cxx11::string::~string((string *)&local_2d58);
              std::__cxx11::string::~string((string *)&local_4968);
              std::__cxx11::string::~string((string *)&local_4948);
              std::__cxx11::string::~string(local_2d38);
            }
            ptVar6 = &score.decomposition;
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar4 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<char,_int,_long>::id437 = iVar5 + -1;
        iVar5 = iVar5 + 1;
      }
      if (relop<char,_int,_long>::id437 == iVar3) {
        uVar4 = 1;
        uVar2 = 0;
        while (uVar2 < uVar4) {
          ptVar6 = local_1750;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)ptVar6,"value     != engaged",(allocator<char> *)local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,ptVar6);
          while( true ) {
            std::__cxx11::string::~string((string *)ptVar6);
            bVar7 = lest__ctx_section.once == false;
            lest__ctx_section.once = false;
            if (bVar7) break;
            local_4cbc = 6;
            local_4c78[0] = (allocator<char> *)&local_4cbc;
            lest::expression_lhs<int_const&>::operator!=
                      (&score,(expression_lhs<int_const&> *)local_4c78,&e2);
            if (score.passed == false) {
              local_4cf0 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_1770,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)local_4c78);
              std::__cxx11::string::string((string *)local_3ce8,local_1770);
              local_3ce8[0].line = 0x1b5;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_2d98,"6 != e2",(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_1790,(string *)&score.decomposition);
              lest::failure::failure(local_4cf0,local_3ce8,local_2d98,&local_1790);
              __cxa_throw(local_4cf0,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_2db8,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_4990,local_2db8);
              local_4990.line = 0x1b5;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_49b0,"6 != e2",&local_4cf1);
              std::__cxx11::string::string((string *)&local_2dd8,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)local_4c78,&local_4990,&local_49b0,&local_2dd8,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_4b0,lest_env);
              lest::report(poVar1,(message *)local_4c78,&local_4b0);
              std::__cxx11::string::~string((string *)&local_4b0);
              lest::message::~message((message *)local_4c78);
              std::__cxx11::string::~string((string *)&local_2dd8);
              std::__cxx11::string::~string((string *)&local_49b0);
              std::__cxx11::string::~string((string *)&local_4990);
              std::__cxx11::string::~string(local_2db8);
            }
            ptVar6 = &score.decomposition;
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar4 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<char,_int,_long>::id438 = iVar5 + -1;
        iVar5 = iVar5 + 1;
      }
      if (relop<char,_int,_long>::id438 == iVar3) {
        uVar4 = 1;
        uVar2 = 0;
        while (uVar2 < uVar4) {
          ptVar6 = local_17d0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)ptVar6,"engaged   <  value",(allocator<char> *)local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,ptVar6);
          while( true ) {
            std::__cxx11::string::~string((string *)ptVar6);
            bVar7 = lest__ctx_section.once == false;
            lest__ctx_section.once = false;
            if (bVar7) break;
            local_4c78[0] = (allocator<char> *)&e1;
            local_4cbc = 7;
            lest::expression_lhs<std::optional<int>const&>::operator<
                      (&score,(expression_lhs<std::optional<int>const&> *)local_4c78,
                       (int *)&local_4cbc);
            if (score.passed == false) {
              local_4cf0 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_17f0,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)local_4c78);
              std::__cxx11::string::string((string *)local_3d38,local_17f0);
              local_3d38[0].line = 0x1b6;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_2e18,"e1 < 7",(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_1810,(string *)&score.decomposition);
              lest::failure::failure(local_4cf0,local_3d38,local_2e18,&local_1810);
              __cxa_throw(local_4cf0,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_2e38,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_49d8,local_2e38);
              local_49d8.line = 0x1b6;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_49f8,"e1 < 7",&local_4cf1);
              std::__cxx11::string::string((string *)&local_2e58,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)local_4c78,&local_49d8,&local_49f8,&local_2e58,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_4d0,lest_env);
              lest::report(poVar1,(message *)local_4c78,&local_4d0);
              std::__cxx11::string::~string((string *)&local_4d0);
              lest::message::~message((message *)local_4c78);
              std::__cxx11::string::~string((string *)&local_2e58);
              std::__cxx11::string::~string((string *)&local_49f8);
              std::__cxx11::string::~string((string *)&local_49d8);
              std::__cxx11::string::~string(local_2e38);
            }
            ptVar6 = &score.decomposition;
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar4 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<char,_int,_long>::id439 = iVar5 + -1;
        iVar5 = iVar5 + 1;
      }
      if (relop<char,_int,_long>::id439 == iVar3) {
        uVar4 = 1;
        uVar2 = 0;
        while (uVar2 < uVar4) {
          ptVar6 = local_1850;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)ptVar6,"value     <  engaged",(allocator<char> *)local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,ptVar6);
          while( true ) {
            std::__cxx11::string::~string((string *)ptVar6);
            bVar7 = lest__ctx_section.once == false;
            lest__ctx_section.once = false;
            if (bVar7) break;
            local_4cbc = 6;
            local_4c78[0] = (allocator<char> *)&local_4cbc;
            lest::expression_lhs<int_const&>::operator<
                      (&score,(expression_lhs<int_const&> *)local_4c78,&e2);
            if (score.passed == false) {
              local_4cf0 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_1870,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)local_4c78);
              std::__cxx11::string::string((string *)local_3d88,local_1870);
              local_3d88[0].line = 0x1b7;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_2e98,"6 < e2",(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_1890,(string *)&score.decomposition);
              lest::failure::failure(local_4cf0,local_3d88,local_2e98,&local_1890);
              __cxa_throw(local_4cf0,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_2eb8,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_4a20,local_2eb8);
              local_4a20.line = 0x1b7;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4a40,"6 < e2",&local_4cf1);
              std::__cxx11::string::string((string *)&local_2ed8,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)local_4c78,&local_4a20,&local_4a40,&local_2ed8,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_4f0,lest_env);
              lest::report(poVar1,(message *)local_4c78,&local_4f0);
              std::__cxx11::string::~string((string *)&local_4f0);
              lest::message::~message((message *)local_4c78);
              std::__cxx11::string::~string((string *)&local_2ed8);
              std::__cxx11::string::~string((string *)&local_4a40);
              std::__cxx11::string::~string((string *)&local_4a20);
              std::__cxx11::string::~string(local_2eb8);
            }
            ptVar6 = &score.decomposition;
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar4 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<char,_int,_long>::id440 = iVar5 + -1;
        iVar5 = iVar5 + 1;
      }
      if (relop<char,_int,_long>::id440 == iVar3) {
        uVar4 = 1;
        uVar2 = 0;
        while (uVar2 < uVar4) {
          ptVar6 = local_18d0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)ptVar6,"engaged   <= value",(allocator<char> *)local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,ptVar6);
          while( true ) {
            std::__cxx11::string::~string((string *)ptVar6);
            bVar7 = lest__ctx_section.once == false;
            lest__ctx_section.once = false;
            if (bVar7) break;
            local_4c78[0] = (allocator<char> *)&e1;
            local_4cbc = 7;
            lest::expression_lhs<std::optional<int>const&>::operator<=
                      (&score,(expression_lhs<std::optional<int>const&> *)local_4c78,
                       (int *)&local_4cbc);
            if (score.passed == false) {
              local_4cf0 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_18f0,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)local_4c78);
              std::__cxx11::string::string((string *)local_3dd8,local_18f0);
              local_3dd8[0].line = 0x1b8;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_2f18,"e1 <= 7",(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_1910,(string *)&score.decomposition);
              lest::failure::failure(local_4cf0,local_3dd8,local_2f18,&local_1910);
              __cxa_throw(local_4cf0,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_2f38,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_4a68,local_2f38);
              local_4a68.line = 0x1b8;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4a88,"e1 <= 7",&local_4cf1);
              std::__cxx11::string::string((string *)&local_2f58,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)local_4c78,&local_4a68,&local_4a88,&local_2f58,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_510,lest_env);
              lest::report(poVar1,(message *)local_4c78,&local_510);
              std::__cxx11::string::~string((string *)&local_510);
              lest::message::~message((message *)local_4c78);
              std::__cxx11::string::~string((string *)&local_2f58);
              std::__cxx11::string::~string((string *)&local_4a88);
              std::__cxx11::string::~string((string *)&local_4a68);
              std::__cxx11::string::~string(local_2f38);
            }
            ptVar6 = &score.decomposition;
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar4 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<char,_int,_long>::id441 = iVar5 + -1;
        iVar5 = iVar5 + 1;
      }
      if (relop<char,_int,_long>::id441 == iVar3) {
        uVar4 = 1;
        uVar2 = 0;
        while (uVar2 < uVar4) {
          ptVar6 = local_1950;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)ptVar6,"value     <= engaged",(allocator<char> *)local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,ptVar6);
          while( true ) {
            std::__cxx11::string::~string((string *)ptVar6);
            bVar7 = lest__ctx_section.once == false;
            lest__ctx_section.once = false;
            if (bVar7) break;
            local_4cbc = 6;
            local_4c78[0] = (allocator<char> *)&local_4cbc;
            lest::expression_lhs<int_const&>::operator<=
                      (&score,(expression_lhs<int_const&> *)local_4c78,&e2);
            if (score.passed == false) {
              local_4cf0 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_1970,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)local_4c78);
              std::__cxx11::string::string((string *)local_3e28,local_1970);
              local_3e28[0].line = 0x1b9;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_2f98,"6 <= e2",(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_1990,(string *)&score.decomposition);
              lest::failure::failure(local_4cf0,local_3e28,local_2f98,&local_1990);
              __cxa_throw(local_4cf0,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_2fb8,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_4ab0,local_2fb8);
              local_4ab0.line = 0x1b9;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4ad0,"6 <= e2",&local_4cf1);
              std::__cxx11::string::string((string *)&local_2fd8,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)local_4c78,&local_4ab0,&local_4ad0,&local_2fd8,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_530,lest_env);
              lest::report(poVar1,(message *)local_4c78,&local_530);
              std::__cxx11::string::~string((string *)&local_530);
              lest::message::~message((message *)local_4c78);
              std::__cxx11::string::~string((string *)&local_2fd8);
              std::__cxx11::string::~string((string *)&local_4ad0);
              std::__cxx11::string::~string((string *)&local_4ab0);
              std::__cxx11::string::~string(local_2fb8);
            }
            ptVar6 = &score.decomposition;
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar4 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<char,_int,_long>::id442 = iVar5 + -1;
        iVar5 = iVar5 + 1;
      }
      if (relop<char,_int,_long>::id442 == iVar3) {
        uVar4 = 1;
        uVar2 = 0;
        while (uVar2 < uVar4) {
          ptVar6 = local_19d0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)ptVar6,"engaged   >  value",(allocator<char> *)local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,ptVar6);
          while( true ) {
            std::__cxx11::string::~string((string *)ptVar6);
            bVar7 = lest__ctx_section.once == false;
            lest__ctx_section.once = false;
            if (bVar7) break;
            local_4c78[0] = (allocator<char> *)&e2;
            local_4cbc = 6;
            lest::expression_lhs<std::optional<long>const&>::operator>
                      (&score,(expression_lhs<std::optional<long>const&> *)local_4c78,
                       (int *)&local_4cbc);
            if (score.passed == false) {
              local_4cf0 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_19f0,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)local_4c78);
              std::__cxx11::string::string((string *)local_3e78,local_19f0);
              local_3e78[0].line = 0x1ba;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_3018,"e2 > 6",(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_1a10,(string *)&score.decomposition);
              lest::failure::failure(local_4cf0,local_3e78,local_3018,&local_1a10);
              __cxa_throw(local_4cf0,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_3038,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_4af8,local_3038);
              local_4af8.line = 0x1ba;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4b18,"e2 > 6",&local_4cf1);
              std::__cxx11::string::string((string *)&local_3058,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)local_4c78,&local_4af8,&local_4b18,&local_3058,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_550,lest_env);
              lest::report(poVar1,(message *)local_4c78,&local_550);
              std::__cxx11::string::~string((string *)&local_550);
              lest::message::~message((message *)local_4c78);
              std::__cxx11::string::~string((string *)&local_3058);
              std::__cxx11::string::~string((string *)&local_4b18);
              std::__cxx11::string::~string((string *)&local_4af8);
              std::__cxx11::string::~string(local_3038);
            }
            ptVar6 = &score.decomposition;
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar4 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<char,_int,_long>::id443 = iVar5 + -1;
        iVar5 = iVar5 + 1;
      }
      if (relop<char,_int,_long>::id443 == iVar3) {
        uVar4 = 1;
        uVar2 = 0;
        while (uVar2 < uVar4) {
          ptVar6 = local_1a50;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)ptVar6,"value     >  engaged",(allocator<char> *)local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,ptVar6);
          while( true ) {
            std::__cxx11::string::~string((string *)ptVar6);
            bVar7 = lest__ctx_section.once == false;
            lest__ctx_section.once = false;
            if (bVar7) break;
            local_4cbc = 7;
            local_4c78[0] = (allocator<char> *)&local_4cbc;
            lest::expression_lhs<int_const&>::operator>
                      (&score,(expression_lhs<int_const&> *)local_4c78,&e1);
            if (score.passed == false) {
              local_4cf0 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_1a70,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)local_4c78);
              std::__cxx11::string::string((string *)local_3ec8,local_1a70);
              local_3ec8[0].line = 0x1bb;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_3098,"7 > e1",(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_1a90,(string *)&score.decomposition);
              lest::failure::failure(local_4cf0,local_3ec8,local_3098,&local_1a90);
              __cxa_throw(local_4cf0,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_30b8,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_4b40,local_30b8);
              local_4b40.line = 0x1bb;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4b60,"7 > e1",&local_4cf1);
              std::__cxx11::string::string((string *)&local_30d8,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)local_4c78,&local_4b40,&local_4b60,&local_30d8,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_570,lest_env);
              lest::report(poVar1,(message *)local_4c78,&local_570);
              std::__cxx11::string::~string((string *)&local_570);
              lest::message::~message((message *)local_4c78);
              std::__cxx11::string::~string((string *)&local_30d8);
              std::__cxx11::string::~string((string *)&local_4b60);
              std::__cxx11::string::~string((string *)&local_4b40);
              std::__cxx11::string::~string(local_30b8);
            }
            ptVar6 = &score.decomposition;
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar4 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<char,_int,_long>::id444 = iVar5 + -1;
        iVar5 = iVar5 + 1;
      }
      if (relop<char,_int,_long>::id444 == iVar3) {
        uVar4 = 1;
        uVar2 = 0;
        while (uVar2 < uVar4) {
          ptVar6 = local_1ad0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)ptVar6,"engaged   >= value",(allocator<char> *)local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,ptVar6);
          while( true ) {
            std::__cxx11::string::~string((string *)ptVar6);
            bVar7 = lest__ctx_section.once == false;
            lest__ctx_section.once = false;
            if (bVar7) break;
            local_4c78[0] = (allocator<char> *)&e2;
            local_4cbc = 6;
            lest::expression_lhs<std::optional<long>const&>::operator>=
                      (&score,(expression_lhs<std::optional<long>const&> *)local_4c78,
                       (int *)&local_4cbc);
            if (score.passed == false) {
              local_4cf0 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_1af0,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)local_4c78);
              std::__cxx11::string::string((string *)local_3f18,local_1af0);
              local_3f18[0].line = 0x1bc;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_3118,"e2 >= 6",(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_1b10,(string *)&score.decomposition);
              lest::failure::failure(local_4cf0,local_3f18,local_3118,&local_1b10);
              __cxa_throw(local_4cf0,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_3138,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_4b88,local_3138);
              local_4b88.line = 0x1bc;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4ba8,"e2 >= 6",&local_4cf1);
              std::__cxx11::string::string((string *)&local_3158,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)local_4c78,&local_4b88,&local_4ba8,&local_3158,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_590,lest_env);
              lest::report(poVar1,(message *)local_4c78,&local_590);
              std::__cxx11::string::~string((string *)&local_590);
              lest::message::~message((message *)local_4c78);
              std::__cxx11::string::~string((string *)&local_3158);
              std::__cxx11::string::~string((string *)&local_4ba8);
              std::__cxx11::string::~string((string *)&local_4b88);
              std::__cxx11::string::~string(local_3138);
            }
            ptVar6 = &score.decomposition;
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar4 = 0;
          uVar2 = 1;
        }
      }
      if (iVar3 == 0) {
        relop<char,_int,_long>::id445 = iVar5 + -1;
        iVar5 = iVar5 + 1;
      }
      if (relop<char,_int,_long>::id445 == iVar3) {
        uVar4 = 1;
        uVar2 = 0;
        while (uVar2 < uVar4) {
          ptVar6 = local_1b50;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)ptVar6,"value     >= engaged",(allocator<char> *)local_4c78);
          lest::ctx::ctx(&lest__ctx_section,lest_env,ptVar6);
          while( true ) {
            std::__cxx11::string::~string((string *)ptVar6);
            bVar7 = lest__ctx_section.once == false;
            lest__ctx_section.once = false;
            if (bVar7) break;
            local_4cbc = 7;
            local_4c78[0] = (allocator<char> *)&local_4cbc;
            lest::expression_lhs<int_const&>::operator>=
                      (&score,(expression_lhs<int_const&> *)local_4c78,&e1);
            if (score.passed == false) {
              local_4cf0 = (failure *)__cxa_allocate_exception(0x78);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_1b70,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)local_4c78);
              std::__cxx11::string::string((string *)local_3f68,local_1b70);
              local_3f68[0].line = 0x1bd;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_3198,"7 >= e1",(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_1b90,(string *)&score.decomposition);
              lest::failure::failure(local_4cf0,local_3f68,local_3198,&local_1b90);
              __cxa_throw(local_4cf0,&lest::failure::typeinfo,lest::message::~message);
            }
            if ((lest_env->opt).pass == true) {
              poVar1 = lest_env->os;
              std::__cxx11::string::string<std::allocator<char>>
                        (local_31b8,
                         "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                         ,(allocator<char> *)&local_4cbc);
              std::__cxx11::string::string((string *)&local_4bd0,local_31b8);
              local_4bd0.line = 0x1bd;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4bf0,"7 >= e1",&local_4cf1);
              std::__cxx11::string::string((string *)&local_31d8,(string *)&score.decomposition);
              lest::passing::passing
                        ((passing *)local_4c78,&local_4bd0,&local_4bf0,&local_31d8,
                         (lest_env->opt).zen);
              lest::env::context_abi_cxx11_(&local_5b0,lest_env);
              lest::report(poVar1,(message *)local_4c78,&local_5b0);
              std::__cxx11::string::~string((string *)&local_5b0);
              lest::message::~message((message *)local_4c78);
              std::__cxx11::string::~string((string *)&local_31d8);
              std::__cxx11::string::~string((string *)&local_4bf0);
              std::__cxx11::string::~string((string *)&local_4bd0);
              std::__cxx11::string::~string(local_31b8);
            }
            ptVar6 = &score.decomposition;
          }
          lest::ctx::~ctx(&lest__ctx_section);
          uVar4 = 0;
          uVar2 = 1;
        }
      }
    }
    lest::ctx::~ctx(&lest__ctx_setup);
    bVar7 = iVar3 == 0;
    iVar3 = iVar3 + 1;
    iVar5 = iVar5 - (uint)bVar7;
  } while( true );
}

Assistant:

void relop( lest::env & lest_env )
{
    SETUP( "" ) {
        optional<R> d;
        optional<S> e1( 6 );
        optional<T> e2( 7 );

    SECTION( "engaged    == engaged"    ) { EXPECT(   e1 == e1  ); }
    SECTION( "engaged    == disengaged" ) { EXPECT( !(e1 == d ) ); }
    SECTION( "disengaged == engaged"    ) { EXPECT( !(d  == e1) ); }

    SECTION( "engaged    != engaged"    ) { EXPECT(   e1 != e2  ); }
    SECTION( "engaged    != disengaged" ) { EXPECT(   e1 != d   ); }
    SECTION( "disengaged != engaged"    ) { EXPECT(   d  != e2  ); }

    SECTION( "engaged    <  engaged"    ) { EXPECT(   e1 <  e2  ); }
    SECTION( "engaged    <  disengaged" ) { EXPECT( !(e1 <  d ) ); }
    SECTION( "disengaged <  engaged"    ) { EXPECT(   d  <  e2  ); }

    SECTION( "engaged    <= engaged"    ) { EXPECT(   e1 <= e1  ); }
    SECTION( "engaged    <= engaged"    ) { EXPECT(   e1 <= e2  ); }
    SECTION( "engaged    <= disengaged" ) { EXPECT( !(e1 <= d ) ); }
    SECTION( "disengaged <= engaged"    ) { EXPECT(   d  <= e2  ); }

    SECTION( "engaged    >  engaged"    ) { EXPECT(   e2 >  e1  ); }
    SECTION( "engaged    >  disengaged" ) { EXPECT(   e2 >  d   ); }
    SECTION( "disengaged >  engaged"    ) { EXPECT( !(d  >  e1) ); }

    SECTION( "engaged    >= engaged"    ) { EXPECT(   e1 >= e1  ); }
    SECTION( "engaged    >= engaged"    ) { EXPECT(   e2 >= e1  ); }
    SECTION( "engaged    >= disengaged" ) { EXPECT(   e2 >= d   ); }
    SECTION( "disengaged >= engaged"    ) { EXPECT( !(d  >= e1) ); }

    SECTION( "disengaged == nullopt"    ) { EXPECT(  (d       == nullopt) ); }
    SECTION( "nullopt    == disengaged" ) { EXPECT(  (nullopt == d      ) ); }
    SECTION( "engaged    == nullopt"    ) { EXPECT(  (e1      != nullopt) ); }
    SECTION( "nullopt    == engaged"    ) { EXPECT(  (nullopt != e1     ) ); }
    SECTION( "disengaged == nullopt"    ) { EXPECT( !(d       <  nullopt) ); }
    SECTION( "nullopt    == disengaged" ) { EXPECT( !(nullopt <  d      ) ); }
    SECTION( "disengaged == nullopt"    ) { EXPECT(  (d       <= nullopt) ); }
    SECTION( "nullopt    == disengaged" ) { EXPECT(  (nullopt <= d      ) ); }
    SECTION( "disengaged == nullopt"    ) { EXPECT( !(d       >  nullopt) ); }
    SECTION( "nullopt    == disengaged" ) { EXPECT( !(nullopt >  d      ) ); }
    SECTION( "disengaged == nullopt"    ) { EXPECT(  (d       >= nullopt) ); }
    SECTION( "nullopt    == disengaged" ) { EXPECT(  (nullopt >= d      ) ); }

    SECTION( "engaged    == value"      ) { EXPECT( e1 == 6  ); }
    SECTION( "value     == engaged"     ) { EXPECT(  6 == e1 ); }
    SECTION( "engaged   != value"       ) { EXPECT( e1 != 7  ); }
    SECTION( "value     != engaged"     ) { EXPECT(  6 != e2 ); }
    SECTION( "engaged   <  value"       ) { EXPECT( e1 <  7  ); }
    SECTION( "value     <  engaged"     ) { EXPECT(  6 <  e2 ); }
    SECTION( "engaged   <= value"       ) { EXPECT( e1 <= 7  ); }
    SECTION( "value     <= engaged"     ) { EXPECT(  6 <= e2 ); }
    SECTION( "engaged   >  value"       ) { EXPECT( e2 >  6  ); }
    SECTION( "value     >  engaged"     ) { EXPECT(  7 >  e1 ); }
    SECTION( "engaged   >= value"       ) { EXPECT( e2 >= 6  ); }
    SECTION( "value     >= engaged"     ) { EXPECT(  7 >= e1 ); }
    }
}